

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  ulong uVar58;
  long lVar59;
  byte bVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  uint uVar65;
  float t1;
  float fVar66;
  undefined4 uVar67;
  float fVar68;
  float fVar69;
  float fVar90;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar91;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar85 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar106 [16];
  float fVar92;
  undefined8 uVar93;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 extraout_var [56];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar180;
  float fVar181;
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar183;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar186 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar198;
  undefined1 auVar196 [32];
  float fVar202;
  float fVar203;
  float fVar212;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  float fVar229;
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar230;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  vfloat4 a0_3;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  vfloat4 a0_1;
  undefined1 auVar249 [16];
  float fVar262;
  undefined1 auVar250 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar251 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar260;
  float fVar261;
  undefined1 in_ZMM12 [64];
  undefined1 auVar259 [64];
  vfloat4 a0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar290 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined1 local_548 [32];
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments local_4c8;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  uint auStack_3d8 [4];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 auStack_3b8 [16];
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  uint uStack_288;
  float afStack_284 [7];
  RTCHitN local_268 [16];
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar112 [64];
  undefined1 auVar289 [32];
  
  PVar8 = prim[1];
  uVar63 = (ulong)(byte)PVar8;
  fVar66 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar70._0_4_ = fVar66 * auVar106._0_4_;
  auVar70._4_4_ = fVar66 * auVar106._4_4_;
  auVar70._8_4_ = fVar66 * auVar106._8_4_;
  auVar70._12_4_ = fVar66 * auVar106._12_4_;
  auVar154._0_4_ = fVar66 * auVar135._0_4_;
  auVar154._4_4_ = fVar66 * auVar135._4_4_;
  auVar154._8_4_ = fVar66 * auVar135._8_4_;
  auVar154._12_4_ = fVar66 * auVar135._12_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar63 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar106);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar63 * 5 + 6);
  auVar14 = vpmovsxbd_avx2(auVar135);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar63 * 6 + 6);
  auVar15 = vpmovsxbd_avx2(auVar132);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar16 = vpmovsxbd_avx2(auVar3);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar63 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar58 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar58 + 6);
  auVar258 = vpmovsxbd_avx2(auVar6);
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar58 + uVar63 + 6);
  auVar19 = vpmovsxbd_avx2(auVar215);
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar58 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar58 + 6);
  auVar20 = vpmovsxbd_avx2(auVar7);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar278._4_4_ = auVar154._0_4_;
  auVar278._0_4_ = auVar154._0_4_;
  auVar278._8_4_ = auVar154._0_4_;
  auVar278._12_4_ = auVar154._0_4_;
  auVar278._16_4_ = auVar154._0_4_;
  auVar278._20_4_ = auVar154._0_4_;
  auVar278._24_4_ = auVar154._0_4_;
  auVar278._28_4_ = auVar154._0_4_;
  auVar106 = vmovshdup_avx(auVar154);
  uVar93 = auVar106._0_8_;
  auVar287._8_8_ = uVar93;
  auVar287._0_8_ = uVar93;
  auVar287._16_8_ = uVar93;
  auVar287._24_8_ = uVar93;
  auVar106 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar66 = auVar106._0_4_;
  auVar259._0_4_ = fVar66 * auVar15._0_4_;
  fVar69 = auVar106._4_4_;
  auVar259._4_4_ = fVar69 * auVar15._4_4_;
  auVar259._8_4_ = fVar66 * auVar15._8_4_;
  auVar259._12_4_ = fVar69 * auVar15._12_4_;
  auVar259._16_4_ = fVar66 * auVar15._16_4_;
  auVar259._20_4_ = fVar69 * auVar15._20_4_;
  auVar259._28_36_ = in_ZMM12._28_36_;
  auVar259._24_4_ = fVar66 * auVar15._24_4_;
  auVar228._0_4_ = auVar18._0_4_ * fVar66;
  auVar228._4_4_ = auVar18._4_4_ * fVar69;
  auVar228._8_4_ = auVar18._8_4_ * fVar66;
  auVar228._12_4_ = auVar18._12_4_ * fVar69;
  auVar228._16_4_ = auVar18._16_4_ * fVar66;
  auVar228._20_4_ = auVar18._20_4_ * fVar69;
  auVar228._28_36_ = in_ZMM10._28_36_;
  auVar228._24_4_ = auVar18._24_4_ * fVar66;
  auVar226._0_4_ = auVar20._0_4_ * fVar66;
  auVar226._4_4_ = auVar20._4_4_ * fVar69;
  auVar226._8_4_ = auVar20._8_4_ * fVar66;
  auVar226._12_4_ = auVar20._12_4_ * fVar69;
  auVar226._16_4_ = auVar20._16_4_ * fVar66;
  auVar226._20_4_ = auVar20._20_4_ * fVar69;
  auVar226._24_4_ = auVar20._24_4_ * fVar66;
  auVar226._28_4_ = 0;
  auVar106 = vfmadd231ps_fma(auVar259._0_32_,auVar287,auVar14);
  auVar135 = vfmadd231ps_fma(auVar228._0_32_,auVar287,auVar17);
  auVar132 = vfmadd231ps_fma(auVar226,auVar19,auVar287);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar278,auVar86);
  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar278,auVar16);
  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar258,auVar278);
  auVar279._4_4_ = auVar70._0_4_;
  auVar279._0_4_ = auVar70._0_4_;
  auVar279._8_4_ = auVar70._0_4_;
  auVar279._12_4_ = auVar70._0_4_;
  auVar279._16_4_ = auVar70._0_4_;
  auVar279._20_4_ = auVar70._0_4_;
  auVar279._24_4_ = auVar70._0_4_;
  auVar279._28_4_ = auVar70._0_4_;
  auVar106 = vmovshdup_avx(auVar70);
  uVar93 = auVar106._0_8_;
  auVar288._8_8_ = uVar93;
  auVar288._0_8_ = uVar93;
  auVar288._16_8_ = uVar93;
  auVar288._24_8_ = uVar93;
  auVar106 = vshufps_avx(auVar70,auVar70,0xaa);
  fVar66 = auVar106._0_4_;
  auVar192._0_4_ = fVar66 * auVar15._0_4_;
  fVar69 = auVar106._4_4_;
  auVar192._4_4_ = fVar69 * auVar15._4_4_;
  auVar192._8_4_ = fVar66 * auVar15._8_4_;
  auVar192._12_4_ = fVar69 * auVar15._12_4_;
  auVar192._16_4_ = fVar66 * auVar15._16_4_;
  auVar192._20_4_ = fVar69 * auVar15._20_4_;
  auVar192._24_4_ = fVar66 * auVar15._24_4_;
  auVar192._28_4_ = 0;
  auVar23._4_4_ = auVar18._4_4_ * fVar69;
  auVar23._0_4_ = auVar18._0_4_ * fVar66;
  auVar23._8_4_ = auVar18._8_4_ * fVar66;
  auVar23._12_4_ = auVar18._12_4_ * fVar69;
  auVar23._16_4_ = auVar18._16_4_ * fVar66;
  auVar23._20_4_ = auVar18._20_4_ * fVar69;
  auVar23._24_4_ = auVar18._24_4_ * fVar66;
  auVar23._28_4_ = auVar15._28_4_;
  auVar15._4_4_ = auVar20._4_4_ * fVar69;
  auVar15._0_4_ = auVar20._0_4_ * fVar66;
  auVar15._8_4_ = auVar20._8_4_ * fVar66;
  auVar15._12_4_ = auVar20._12_4_ * fVar69;
  auVar15._16_4_ = auVar20._16_4_ * fVar66;
  auVar15._20_4_ = auVar20._20_4_ * fVar69;
  auVar15._24_4_ = auVar20._24_4_ * fVar66;
  auVar15._28_4_ = fVar69;
  auVar106 = vfmadd231ps_fma(auVar192,auVar288,auVar14);
  auVar4 = vfmadd231ps_fma(auVar23,auVar288,auVar17);
  auVar5 = vfmadd231ps_fma(auVar15,auVar288,auVar19);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar279,auVar86);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar279,auVar16);
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar146._16_4_ = 0x219392ef;
  auVar146._20_4_ = 0x219392ef;
  auVar146._24_4_ = 0x219392ef;
  auVar146._28_4_ = 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar3),auVar122);
  auVar86 = vcmpps_avx(auVar86,auVar146,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar3),auVar146,auVar86);
  auVar86 = vandps_avx(ZEXT1632(auVar135),auVar122);
  auVar86 = vcmpps_avx(auVar86,auVar146,1);
  auVar15 = vblendvps_avx(ZEXT1632(auVar135),auVar146,auVar86);
  auVar86 = vandps_avx(ZEXT1632(auVar132),auVar122);
  auVar86 = vcmpps_avx(auVar86,auVar146,1);
  auVar86 = vblendvps_avx(ZEXT1632(auVar132),auVar146,auVar86);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar279,auVar258);
  auVar16 = vrcpps_avx(auVar14);
  auVar161._8_4_ = 0x3f800000;
  auVar161._0_8_ = 0x3f8000003f800000;
  auVar161._12_4_ = 0x3f800000;
  auVar161._16_4_ = 0x3f800000;
  auVar161._20_4_ = 0x3f800000;
  auVar161._24_4_ = 0x3f800000;
  auVar161._28_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar14,auVar16,auVar161);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar135 = vfnmadd213ps_fma(auVar15,auVar14,auVar161);
  auVar135 = vfmadd132ps_fma(ZEXT1632(auVar135),auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar86);
  auVar132 = vfnmadd213ps_fma(auVar86,auVar14,auVar161);
  auVar132 = vfmadd132ps_fma(ZEXT1632(auVar132),auVar14,auVar14);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar6));
  auVar16._4_4_ = auVar106._4_4_ * auVar86._4_4_;
  auVar16._0_4_ = auVar106._0_4_ * auVar86._0_4_;
  auVar16._8_4_ = auVar106._8_4_ * auVar86._8_4_;
  auVar16._12_4_ = auVar106._12_4_ * auVar86._12_4_;
  auVar16._16_4_ = auVar86._16_4_ * 0.0;
  auVar16._20_4_ = auVar86._20_4_ * 0.0;
  auVar16._24_4_ = auVar86._24_4_ * 0.0;
  auVar16._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar6));
  auVar17._4_4_ = auVar106._4_4_ * auVar86._4_4_;
  auVar17._0_4_ = auVar106._0_4_ * auVar86._0_4_;
  auVar17._8_4_ = auVar106._8_4_ * auVar86._8_4_;
  auVar17._12_4_ = auVar106._12_4_ * auVar86._12_4_;
  auVar17._16_4_ = auVar86._16_4_ * 0.0;
  auVar17._20_4_ = auVar86._20_4_ * 0.0;
  auVar17._24_4_ = auVar86._24_4_ * 0.0;
  auVar17._28_4_ = auVar86._28_4_;
  auVar107._1_3_ = 0;
  auVar107[0] = PVar8;
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar63 * -2 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar4));
  auVar18._4_4_ = auVar86._4_4_ * auVar135._4_4_;
  auVar18._0_4_ = auVar86._0_4_ * auVar135._0_4_;
  auVar18._8_4_ = auVar86._8_4_ * auVar135._8_4_;
  auVar18._12_4_ = auVar86._12_4_ * auVar135._12_4_;
  auVar18._16_4_ = auVar86._16_4_ * 0.0;
  auVar18._20_4_ = auVar86._20_4_ * 0.0;
  auVar18._24_4_ = auVar86._24_4_ * 0.0;
  auVar18._28_4_ = auVar86._28_4_;
  auVar86 = vcvtdq2ps_avx(auVar14);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar4));
  auVar258._4_4_ = auVar135._4_4_ * auVar86._4_4_;
  auVar258._0_4_ = auVar135._0_4_ * auVar86._0_4_;
  auVar258._8_4_ = auVar135._8_4_ * auVar86._8_4_;
  auVar258._12_4_ = auVar135._12_4_ * auVar86._12_4_;
  auVar258._16_4_ = auVar86._16_4_ * 0.0;
  auVar258._20_4_ = auVar86._20_4_ * 0.0;
  auVar258._24_4_ = auVar86._24_4_ * 0.0;
  auVar258._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 + uVar63 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar3));
  auVar19._4_4_ = auVar86._4_4_ * auVar132._4_4_;
  auVar19._0_4_ = auVar86._0_4_ * auVar132._0_4_;
  auVar19._8_4_ = auVar86._8_4_ * auVar132._8_4_;
  auVar19._12_4_ = auVar86._12_4_ * auVar132._12_4_;
  auVar19._16_4_ = auVar86._16_4_ * 0.0;
  auVar19._20_4_ = auVar86._20_4_ * 0.0;
  auVar19._24_4_ = auVar86._24_4_ * 0.0;
  auVar19._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar3));
  auVar20._4_4_ = auVar132._4_4_ * auVar86._4_4_;
  auVar20._0_4_ = auVar132._0_4_ * auVar86._0_4_;
  auVar20._8_4_ = auVar132._8_4_ * auVar86._8_4_;
  auVar20._12_4_ = auVar132._12_4_ * auVar86._12_4_;
  auVar20._16_4_ = auVar86._16_4_ * 0.0;
  auVar20._20_4_ = auVar86._20_4_ * 0.0;
  auVar20._24_4_ = auVar86._24_4_ * 0.0;
  auVar20._28_4_ = auVar86._28_4_;
  auVar86 = vpminsd_avx2(auVar16,auVar17);
  auVar14 = vpminsd_avx2(auVar18,auVar258);
  auVar86 = vmaxps_avx(auVar86,auVar14);
  uVar67 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar193._4_4_ = uVar67;
  auVar193._0_4_ = uVar67;
  auVar193._8_4_ = uVar67;
  auVar193._12_4_ = uVar67;
  auVar193._16_4_ = uVar67;
  auVar193._20_4_ = uVar67;
  auVar193._24_4_ = uVar67;
  auVar193._28_4_ = uVar67;
  auVar14 = vpminsd_avx2(auVar19,auVar20);
  auVar14 = vmaxps_avx(auVar14,auVar193);
  auVar86 = vmaxps_avx(auVar86,auVar14);
  local_1d8._4_4_ = auVar86._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar86._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar86._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar86._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar86._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar86._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar86._24_4_ * 0.99999964;
  local_1d8._28_4_ = auVar14._28_4_;
  auVar86 = vpmaxsd_avx2(auVar16,auVar17);
  auVar14 = vpmaxsd_avx2(auVar18,auVar258);
  auVar86 = vminps_avx(auVar86,auVar14);
  auVar14 = vpmaxsd_avx2(auVar19,auVar20);
  uVar67 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar123._4_4_ = uVar67;
  auVar123._0_4_ = uVar67;
  auVar123._8_4_ = uVar67;
  auVar123._12_4_ = uVar67;
  auVar123._16_4_ = uVar67;
  auVar123._20_4_ = uVar67;
  auVar123._24_4_ = uVar67;
  auVar123._28_4_ = uVar67;
  auVar14 = vminps_avx(auVar14,auVar123);
  auVar86 = vminps_avx(auVar86,auVar14);
  auVar24._4_4_ = auVar86._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar86._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar86._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar86._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar86._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar86._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar86._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar86._28_4_;
  auVar107[4] = PVar8;
  auVar107._5_3_ = 0;
  auVar107[8] = PVar8;
  auVar107._9_3_ = 0;
  auVar107[0xc] = PVar8;
  auVar107._13_3_ = 0;
  auVar107[0x10] = PVar8;
  auVar107._17_3_ = 0;
  auVar107[0x14] = PVar8;
  auVar107._21_3_ = 0;
  auVar107[0x18] = PVar8;
  auVar107._25_3_ = 0;
  auVar107[0x1c] = PVar8;
  auVar107._29_3_ = 0;
  auVar14 = vpcmpgtd_avx2(auVar107,_DAT_01fe9900);
  auVar86 = vcmpps_avx(local_1d8,auVar24,2);
  auVar86 = vandps_avx(auVar86,auVar14);
  uVar57 = vmovmskps_avx(auVar86);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  auVar86._16_16_ = mm_lookupmask_ps._240_16_;
  auVar86._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar86,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_408 = 0x7fffffff;
  uStack_404 = 0x7fffffff;
  uStack_400 = 0x7fffffff;
  uStack_3fc = 0x7fffffff;
  do {
    lVar59 = 0;
    uVar63 = (ulong)uVar57;
    for (uVar58 = uVar63; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      lVar59 = lVar59 + 1;
    }
    uVar57 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar59 * 4 + 6);
    pGVar10 = (context->scene->geometries).items[uVar57].ptr;
    uVar58 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var11 = pGVar10[1].intersectionFilterN;
    pvVar12 = pGVar10[2].userPtr;
    _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar5 = *(undefined1 (*) [16])(_Var13 + uVar58 * (long)pvVar12);
    auVar106 = *(undefined1 (*) [16])(_Var13 + (uVar58 + 1) * (long)pvVar12);
    auVar135 = *(undefined1 (*) [16])(_Var13 + (uVar58 + 2) * (long)pvVar12);
    pfVar1 = (float *)(_Var13 + (long)pvVar12 * (uVar58 + 3));
    fVar66 = *pfVar1;
    fVar69 = pfVar1[1];
    fVar92 = pfVar1[2];
    fVar203 = pfVar1[3];
    lVar59 = *(long *)&pGVar10[1].time_range.upper;
    auVar132 = *(undefined1 (*) [16])(lVar59 + (long)p_Var11 * uVar58);
    auVar3 = *(undefined1 (*) [16])(lVar59 + (long)p_Var11 * (uVar58 + 1));
    auVar4 = *(undefined1 (*) [16])(lVar59 + (long)p_Var11 * (uVar58 + 2));
    uVar63 = uVar63 - 1 & uVar63;
    pfVar1 = (float *)(lVar59 + (long)p_Var11 * (uVar58 + 3));
    fVar163 = *pfVar1;
    fVar180 = pfVar1[1];
    fVar181 = pfVar1[2];
    fVar182 = pfVar1[3];
    if (uVar63 != 0) {
      uVar64 = uVar63 - 1 & uVar63;
      for (uVar58 = uVar63; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
      if (uVar64 != 0) {
        for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar282._8_4_ = 0x80000000;
    auVar282._0_8_ = 0x8000000080000000;
    auVar282._12_4_ = 0x80000000;
    auVar125._0_4_ = fVar163 * -0.0;
    auVar125._4_4_ = fVar180 * -0.0;
    auVar125._8_4_ = fVar181 * -0.0;
    auVar125._12_4_ = fVar182 * -0.0;
    auVar215 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar125);
    auVar71._0_4_ = auVar3._0_4_ + auVar215._0_4_;
    auVar71._4_4_ = auVar3._4_4_ + auVar215._4_4_;
    auVar71._8_4_ = auVar3._8_4_ + auVar215._8_4_;
    auVar71._12_4_ = auVar3._12_4_ + auVar215._12_4_;
    auVar7 = vfmadd231ps_fma(auVar71,auVar132,auVar282);
    auVar94._12_4_ = 0;
    auVar94._0_12_ = ZEXT812(0);
    auVar94 = auVar94 << 0x20;
    auVar113._0_4_ = fVar163 * 0.0;
    auVar113._4_4_ = fVar180 * 0.0;
    auVar113._8_4_ = fVar181 * 0.0;
    auVar113._12_4_ = fVar182 * 0.0;
    auVar204._8_4_ = 0x3f000000;
    auVar204._0_8_ = 0x3f0000003f000000;
    auVar204._12_4_ = 0x3f000000;
    auVar215 = vfmadd231ps_fma(auVar113,auVar4,auVar204);
    auVar215 = vfmadd231ps_fma(auVar215,auVar3,auVar94);
    auVar73 = vfnmadd231ps_fma(auVar215,auVar132,auVar204);
    auVar274._0_4_ = fVar66 * -0.0;
    auVar274._4_4_ = fVar69 * -0.0;
    auVar274._8_4_ = fVar92 * -0.0;
    auVar274._12_4_ = fVar203 * -0.0;
    auVar215 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar135,auVar274);
    auVar263._0_4_ = auVar106._0_4_ + auVar215._0_4_;
    auVar263._4_4_ = auVar106._4_4_ + auVar215._4_4_;
    auVar263._8_4_ = auVar106._8_4_ + auVar215._8_4_;
    auVar263._12_4_ = auVar106._12_4_ + auVar215._12_4_;
    auVar215 = vfmadd231ps_fma(auVar263,auVar5,auVar282);
    auVar249._0_4_ = fVar66 * 0.0;
    auVar249._4_4_ = fVar69 * 0.0;
    auVar249._8_4_ = fVar92 * 0.0;
    auVar249._12_4_ = fVar203 * 0.0;
    auVar70 = vfmadd231ps_fma(auVar249,auVar135,auVar204);
    auVar70 = vfmadd231ps_fma(auVar70,auVar106,auVar94);
    auVar22 = vfnmadd231ps_fma(auVar70,auVar5,auVar204);
    auVar126._0_4_ = auVar4._0_4_ + auVar125._0_4_;
    auVar126._4_4_ = auVar4._4_4_ + auVar125._4_4_;
    auVar126._8_4_ = auVar4._8_4_ + auVar125._8_4_;
    auVar126._12_4_ = auVar4._12_4_ + auVar125._12_4_;
    auVar70 = vfmadd231ps_fma(auVar126,auVar3,auVar94);
    auVar70 = vfmadd231ps_fma(auVar70,auVar132,auVar282);
    auVar139._0_4_ = fVar163 * 0.5;
    auVar139._4_4_ = fVar180 * 0.5;
    auVar139._8_4_ = fVar181 * 0.5;
    auVar139._12_4_ = fVar182 * 0.5;
    auVar4 = vfmadd231ps_fma(auVar139,auVar94,auVar4);
    auVar3 = vfnmadd231ps_fma(auVar4,auVar204,auVar3);
    auVar154 = vfmadd231ps_fma(auVar3,auVar94,auVar132);
    auVar214._0_4_ = auVar274._0_4_ + auVar135._0_4_;
    auVar214._4_4_ = auVar274._4_4_ + auVar135._4_4_;
    auVar214._8_4_ = auVar274._8_4_ + auVar135._8_4_;
    auVar214._12_4_ = auVar274._12_4_ + auVar135._12_4_;
    auVar132 = vfmadd231ps_fma(auVar214,auVar106,auVar94);
    auVar4 = vfmadd231ps_fma(auVar132,auVar5,auVar282);
    auVar231._0_4_ = fVar66 * 0.5;
    auVar231._4_4_ = fVar69 * 0.5;
    auVar231._8_4_ = fVar92 * 0.5;
    auVar231._12_4_ = fVar203 * 0.5;
    auVar135 = vfmadd231ps_fma(auVar231,auVar94,auVar135);
    auVar106 = vfnmadd231ps_fma(auVar135,auVar204,auVar106);
    auVar5 = vfmadd231ps_fma(auVar106,auVar94,auVar5);
    auVar106 = vshufps_avx(auVar73,auVar73,0xc9);
    auVar135 = vshufps_avx(auVar215,auVar215,0xc9);
    fVar124 = auVar73._0_4_;
    auVar164._0_4_ = fVar124 * auVar135._0_4_;
    fVar90 = auVar73._4_4_;
    auVar164._4_4_ = fVar90 * auVar135._4_4_;
    fVar68 = auVar73._8_4_;
    auVar164._8_4_ = fVar68 * auVar135._8_4_;
    fVar91 = auVar73._12_4_;
    auVar164._12_4_ = fVar91 * auVar135._12_4_;
    auVar135 = vfmsub231ps_fma(auVar164,auVar106,auVar215);
    auVar132 = vshufps_avx(auVar135,auVar135,0xc9);
    auVar135 = vshufps_avx(auVar22,auVar22,0xc9);
    auVar165._0_4_ = fVar124 * auVar135._0_4_;
    auVar165._4_4_ = fVar90 * auVar135._4_4_;
    auVar165._8_4_ = fVar68 * auVar135._8_4_;
    auVar165._12_4_ = fVar91 * auVar135._12_4_;
    auVar106 = vfmsub231ps_fma(auVar165,auVar106,auVar22);
    auVar3 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar106 = vshufps_avx(auVar154,auVar154,0xc9);
    auVar135 = vshufps_avx(auVar4,auVar4,0xc9);
    fVar183 = auVar154._0_4_;
    auVar149._0_4_ = fVar183 * auVar135._0_4_;
    fVar230 = auVar154._4_4_;
    auVar149._4_4_ = fVar230 * auVar135._4_4_;
    fVar138 = auVar154._8_4_;
    auVar149._8_4_ = fVar138 * auVar135._8_4_;
    fVar148 = auVar154._12_4_;
    auVar149._12_4_ = fVar148 * auVar135._12_4_;
    auVar135 = vfmsub231ps_fma(auVar149,auVar106,auVar4);
    auVar4 = vshufps_avx(auVar135,auVar135,0xc9);
    auVar135 = vshufps_avx(auVar5,auVar5,0xc9);
    auVar184._0_4_ = fVar183 * auVar135._0_4_;
    auVar184._4_4_ = fVar230 * auVar135._4_4_;
    auVar184._8_4_ = fVar138 * auVar135._8_4_;
    auVar184._12_4_ = fVar148 * auVar135._12_4_;
    auVar135 = vfmsub231ps_fma(auVar184,auVar106,auVar5);
    auVar106 = vdpps_avx(auVar132,auVar132,0x7f);
    auVar5 = vshufps_avx(auVar135,auVar135,0xc9);
    fVar69 = auVar106._0_4_;
    auVar215 = ZEXT416((uint)fVar69);
    auVar135 = vrsqrtss_avx(auVar215,auVar215);
    fVar66 = auVar135._0_4_;
    auVar135 = vdpps_avx(auVar132,auVar3,0x7f);
    fVar66 = fVar66 * 1.5 + fVar69 * -0.5 * fVar66 * fVar66 * fVar66;
    fVar163 = auVar132._0_4_ * fVar66;
    fVar180 = auVar132._4_4_ * fVar66;
    fVar181 = auVar132._8_4_ * fVar66;
    fVar182 = auVar132._12_4_ * fVar66;
    auVar243._0_4_ = auVar3._0_4_ * fVar69;
    auVar243._4_4_ = auVar3._4_4_ * fVar69;
    auVar243._8_4_ = auVar3._8_4_ * fVar69;
    auVar243._12_4_ = auVar3._12_4_ * fVar69;
    fVar69 = auVar135._0_4_;
    auVar205._0_4_ = auVar132._0_4_ * fVar69;
    auVar205._4_4_ = auVar132._4_4_ * fVar69;
    auVar205._8_4_ = auVar132._8_4_ * fVar69;
    auVar205._12_4_ = auVar132._12_4_ * fVar69;
    auVar132 = vsubps_avx(auVar243,auVar205);
    auVar135 = vrcpss_avx(auVar215,auVar215);
    auVar106 = vfnmadd213ss_fma(auVar106,auVar135,SUB6416(ZEXT464(0x40000000),0));
    fVar92 = auVar135._0_4_ * auVar106._0_4_;
    auVar106 = vdpps_avx(auVar4,auVar4,0x7f);
    fVar203 = auVar106._0_4_;
    auVar215 = ZEXT416((uint)fVar203);
    auVar135 = vrsqrtss_avx(auVar215,auVar215);
    fVar69 = auVar135._0_4_;
    fVar69 = fVar69 * 1.5 + fVar203 * -0.5 * fVar69 * fVar69 * fVar69;
    fVar248 = fVar69 * auVar4._0_4_;
    fVar260 = fVar69 * auVar4._4_4_;
    fVar261 = fVar69 * auVar4._8_4_;
    fVar262 = fVar69 * auVar4._12_4_;
    auVar135 = vdpps_avx(auVar4,auVar5,0x7f);
    auVar185._0_4_ = fVar203 * auVar5._0_4_;
    auVar185._4_4_ = fVar203 * auVar5._4_4_;
    auVar185._8_4_ = fVar203 * auVar5._8_4_;
    auVar185._12_4_ = fVar203 * auVar5._12_4_;
    fVar203 = auVar135._0_4_;
    auVar150._0_4_ = fVar203 * auVar4._0_4_;
    auVar150._4_4_ = fVar203 * auVar4._4_4_;
    auVar150._8_4_ = fVar203 * auVar4._8_4_;
    auVar150._12_4_ = fVar203 * auVar4._12_4_;
    auVar3 = vsubps_avx(auVar185,auVar150);
    auVar135 = vrcpss_avx(auVar215,auVar215);
    auVar106 = vfnmadd213ss_fma(auVar106,auVar135,SUB6416(ZEXT464(0x40000000),0));
    fVar203 = auVar106._0_4_ * auVar135._0_4_;
    auVar106 = vshufps_avx(auVar7,auVar7,0xff);
    auVar216._0_4_ = auVar106._0_4_ * fVar163;
    auVar216._4_4_ = auVar106._4_4_ * fVar180;
    auVar216._8_4_ = auVar106._8_4_ * fVar181;
    auVar216._12_4_ = auVar106._12_4_ * fVar182;
    local_438 = vsubps_avx(auVar7,auVar216);
    auVar135 = vshufps_avx(auVar73,auVar73,0xff);
    auVar166._0_4_ = auVar135._0_4_ * fVar163 + fVar66 * auVar132._0_4_ * fVar92 * auVar106._0_4_;
    auVar166._4_4_ = auVar135._4_4_ * fVar180 + fVar66 * auVar132._4_4_ * fVar92 * auVar106._4_4_;
    auVar166._8_4_ = auVar135._8_4_ * fVar181 + fVar66 * auVar132._8_4_ * fVar92 * auVar106._8_4_;
    auVar166._12_4_ =
         auVar135._12_4_ * fVar182 + fVar66 * auVar132._12_4_ * fVar92 * auVar106._12_4_;
    auVar132 = vsubps_avx(auVar73,auVar166);
    local_448._0_4_ = auVar216._0_4_ + auVar7._0_4_;
    local_448._4_4_ = auVar216._4_4_ + auVar7._4_4_;
    fStack_440 = auVar216._8_4_ + auVar7._8_4_;
    fStack_43c = auVar216._12_4_ + auVar7._12_4_;
    auVar106 = vshufps_avx(auVar70,auVar70,0xff);
    auVar114._0_4_ = fVar248 * auVar106._0_4_;
    auVar114._4_4_ = fVar260 * auVar106._4_4_;
    auVar114._8_4_ = fVar261 * auVar106._8_4_;
    auVar114._12_4_ = fVar262 * auVar106._12_4_;
    local_458 = vsubps_avx(auVar70,auVar114);
    auVar135 = vshufps_avx(auVar154,auVar154,0xff);
    auVar128._0_4_ = fVar248 * auVar135._0_4_ + auVar106._0_4_ * fVar69 * auVar3._0_4_ * fVar203;
    auVar128._4_4_ = fVar260 * auVar135._4_4_ + auVar106._4_4_ * fVar69 * auVar3._4_4_ * fVar203;
    auVar128._8_4_ = fVar261 * auVar135._8_4_ + auVar106._8_4_ * fVar69 * auVar3._8_4_ * fVar203;
    auVar128._12_4_ = fVar262 * auVar135._12_4_ + auVar106._12_4_ * fVar69 * auVar3._12_4_ * fVar203
    ;
    auVar106 = vsubps_avx(auVar154,auVar128);
    fVar163 = auVar70._0_4_ + auVar114._0_4_;
    fVar180 = auVar70._4_4_ + auVar114._4_4_;
    fVar181 = auVar70._8_4_ + auVar114._8_4_;
    fVar182 = auVar70._12_4_ + auVar114._12_4_;
    local_468._0_4_ = local_438._0_4_ + auVar132._0_4_ * 0.33333334;
    local_468._4_4_ = local_438._4_4_ + auVar132._4_4_ * 0.33333334;
    local_468._8_4_ = local_438._8_4_ + auVar132._8_4_ * 0.33333334;
    local_468._12_4_ = local_438._12_4_ + auVar132._12_4_ * 0.33333334;
    auVar95._0_4_ = auVar106._0_4_ * 0.33333334;
    auVar95._4_4_ = auVar106._4_4_ * 0.33333334;
    auVar95._8_4_ = auVar106._8_4_ * 0.33333334;
    auVar95._12_4_ = auVar106._12_4_ * 0.33333334;
    local_478 = vsubps_avx(local_458,auVar95);
    local_418 = vsubps_avx(local_438,auVar6);
    auVar106 = vshufps_avx(local_418,local_418,0x55);
    auVar135 = vshufps_avx(local_418,local_418,0xaa);
    aVar2 = pre->ray_space[k].vy.field_0;
    fVar66 = pre->ray_space[k].vz.field_0.m128[0];
    fVar69 = pre->ray_space[k].vz.field_0.m128[1];
    fVar92 = pre->ray_space[k].vz.field_0.m128[2];
    fVar203 = pre->ray_space[k].vz.field_0.m128[3];
    auVar96._0_4_ = fVar66 * auVar135._0_4_;
    auVar96._4_4_ = fVar69 * auVar135._4_4_;
    auVar96._8_4_ = fVar92 * auVar135._8_4_;
    auVar96._12_4_ = fVar203 * auVar135._12_4_;
    auVar132 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar2,auVar106);
    local_428 = vsubps_avx(local_468,auVar6);
    auVar106 = vshufps_avx(local_428,local_428,0x55);
    auVar135 = vshufps_avx(local_428,local_428,0xaa);
    auVar283._0_4_ = fVar66 * auVar135._0_4_;
    auVar283._4_4_ = fVar69 * auVar135._4_4_;
    auVar283._8_4_ = fVar92 * auVar135._8_4_;
    auVar283._12_4_ = fVar203 * auVar135._12_4_;
    auVar135 = vfmadd231ps_fma(auVar283,(undefined1  [16])aVar2,auVar106);
    local_2e8 = vsubps_avx(local_478,auVar6);
    auVar106 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar250._0_4_ = fVar66 * auVar106._0_4_;
    auVar250._4_4_ = fVar69 * auVar106._4_4_;
    auVar250._8_4_ = fVar92 * auVar106._8_4_;
    auVar250._12_4_ = fVar203 * auVar106._12_4_;
    auVar106 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar3 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar2,auVar106);
    local_2f8 = vsubps_avx(local_458,auVar6);
    auVar106 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar264._0_4_ = fVar66 * auVar106._0_4_;
    auVar264._4_4_ = fVar69 * auVar106._4_4_;
    auVar264._8_4_ = fVar92 * auVar106._8_4_;
    auVar264._12_4_ = fVar203 * auVar106._12_4_;
    auVar106 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar4 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar2,auVar106);
    local_308 = vsubps_avx(_local_448,auVar6);
    auVar106 = vshufps_avx(local_308,local_308,0xaa);
    auVar151._0_4_ = fVar66 * auVar106._0_4_;
    auVar151._4_4_ = fVar69 * auVar106._4_4_;
    auVar151._8_4_ = fVar92 * auVar106._8_4_;
    auVar151._12_4_ = fVar203 * auVar106._12_4_;
    auVar106 = vshufps_avx(local_308,local_308,0x55);
    auVar5 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar106);
    local_488._0_4_ = (fVar124 + auVar166._0_4_) * 0.33333334 + (float)local_448._0_4_;
    local_488._4_4_ = (fVar90 + auVar166._4_4_) * 0.33333334 + (float)local_448._4_4_;
    fStack_480 = (fVar68 + auVar166._8_4_) * 0.33333334 + fStack_440;
    fStack_47c = (fVar91 + auVar166._12_4_) * 0.33333334 + fStack_43c;
    local_318 = vsubps_avx(_local_488,auVar6);
    auVar106 = vshufps_avx(local_318,local_318,0xaa);
    auVar206._0_4_ = auVar106._0_4_ * fVar66;
    auVar206._4_4_ = auVar106._4_4_ * fVar69;
    auVar206._8_4_ = auVar106._8_4_ * fVar92;
    auVar206._12_4_ = auVar106._12_4_ * fVar203;
    auVar106 = vshufps_avx(local_318,local_318,0x55);
    auVar215 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar2,auVar106);
    auVar217._0_4_ = (fVar183 + auVar128._0_4_) * 0.33333334;
    auVar217._4_4_ = (fVar230 + auVar128._4_4_) * 0.33333334;
    auVar217._8_4_ = (fVar138 + auVar128._8_4_) * 0.33333334;
    auVar217._12_4_ = (fVar148 + auVar128._12_4_) * 0.33333334;
    auVar22._4_4_ = fVar180;
    auVar22._0_4_ = fVar163;
    auVar22._8_4_ = fVar181;
    auVar22._12_4_ = fVar182;
    _local_498 = vsubps_avx(auVar22,auVar217);
    local_328 = vsubps_avx(_local_498,auVar6);
    auVar106 = vshufps_avx(local_328,local_328,0xaa);
    auVar218._0_4_ = auVar106._0_4_ * fVar66;
    auVar218._4_4_ = auVar106._4_4_ * fVar69;
    auVar218._8_4_ = auVar106._8_4_ * fVar92;
    auVar218._12_4_ = auVar106._12_4_ * fVar203;
    auVar106 = vshufps_avx(local_328,local_328,0x55);
    auVar7 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar106);
    local_338 = vsubps_avx(auVar22,auVar6);
    auVar106 = vshufps_avx(local_338,local_338,0xaa);
    auVar72._0_4_ = fVar66 * auVar106._0_4_;
    auVar72._4_4_ = fVar69 * auVar106._4_4_;
    auVar72._8_4_ = fVar92 * auVar106._8_4_;
    auVar72._12_4_ = fVar203 * auVar106._12_4_;
    auVar106 = vshufps_avx(local_338,local_338,0x55);
    auVar106 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar106);
    auVar167._4_4_ = local_418._0_4_;
    auVar167._0_4_ = local_418._0_4_;
    auVar167._8_4_ = local_418._0_4_;
    auVar167._12_4_ = local_418._0_4_;
    aVar2 = pre->ray_space[k].vx.field_0;
    auVar6 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar167);
    auVar168._4_4_ = local_428._0_4_;
    auVar168._0_4_ = local_428._0_4_;
    auVar168._8_4_ = local_428._0_4_;
    auVar168._12_4_ = local_428._0_4_;
    auVar70 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar2,auVar168);
    uVar67 = local_2e8._0_4_;
    auVar169._4_4_ = uVar67;
    auVar169._0_4_ = uVar67;
    auVar169._8_4_ = uVar67;
    auVar169._12_4_ = uVar67;
    auVar154 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar169);
    uVar67 = local_2f8._0_4_;
    auVar170._4_4_ = uVar67;
    auVar170._0_4_ = uVar67;
    auVar170._8_4_ = uVar67;
    auVar170._12_4_ = uVar67;
    auVar73 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar170);
    uVar67 = local_308._0_4_;
    auVar171._4_4_ = uVar67;
    auVar171._0_4_ = uVar67;
    auVar171._8_4_ = uVar67;
    auVar171._12_4_ = uVar67;
    auVar22 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar171);
    uVar67 = local_318._0_4_;
    auVar172._4_4_ = uVar67;
    auVar172._0_4_ = uVar67;
    auVar172._8_4_ = uVar67;
    auVar172._12_4_ = uVar67;
    auVar215 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar172);
    uVar67 = local_328._0_4_;
    auVar173._4_4_ = uVar67;
    auVar173._0_4_ = uVar67;
    auVar173._8_4_ = uVar67;
    auVar173._12_4_ = uVar67;
    auVar7 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar2,auVar173);
    uVar67 = local_338._0_4_;
    auVar174._4_4_ = uVar67;
    auVar174._0_4_ = uVar67;
    auVar174._8_4_ = uVar67;
    auVar174._12_4_ = uVar67;
    auVar94 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar174);
    auVar3 = vmovlhps_avx(auVar6,auVar22);
    auVar4 = vmovlhps_avx(auVar70,auVar215);
    auVar5 = vmovlhps_avx(auVar154,auVar7);
    _local_298 = vmovlhps_avx(auVar73,auVar94);
    auVar106 = vminps_avx(auVar3,auVar4);
    auVar135 = vminps_avx(auVar5,_local_298);
    auVar132 = vminps_avx(auVar106,auVar135);
    auVar106 = vmaxps_avx(auVar3,auVar4);
    auVar135 = vmaxps_avx(auVar5,_local_298);
    auVar106 = vmaxps_avx(auVar106,auVar135);
    auVar135 = vshufpd_avx(auVar132,auVar132,3);
    auVar132 = vminps_avx(auVar132,auVar135);
    auVar135 = vshufpd_avx(auVar106,auVar106,3);
    auVar135 = vmaxps_avx(auVar106,auVar135);
    auVar244._4_4_ = uStack_404;
    auVar244._0_4_ = local_408;
    auVar244._8_4_ = uStack_400;
    auVar244._12_4_ = uStack_3fc;
    auVar106 = vandps_avx(auVar244,auVar132);
    auVar135 = vandps_avx(auVar244,auVar135);
    auVar106 = vmaxps_avx(auVar106,auVar135);
    auVar135 = vmovshdup_avx(auVar106);
    auVar106 = vmaxss_avx(auVar135,auVar106);
    local_78 = auVar106._0_4_ * 9.536743e-07;
    auVar186._8_8_ = auVar6._0_8_;
    auVar186._0_8_ = auVar6._0_8_;
    auVar232._8_8_ = auVar70._0_8_;
    auVar232._0_8_ = auVar70._0_8_;
    auVar251._0_8_ = auVar154._0_8_;
    auVar251._8_8_ = auVar251._0_8_;
    auVar265._0_8_ = auVar73._0_8_;
    auVar265._8_8_ = auVar265._0_8_;
    local_2a8 = ZEXT416((uint)local_78);
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    fStack_90 = -local_78;
    local_98 = -local_78;
    fStack_94 = -local_78;
    fStack_8c = fStack_90;
    fStack_88 = fStack_90;
    fStack_84 = fStack_90;
    fStack_80 = fStack_90;
    fStack_7c = fStack_90;
    local_398 = uVar57;
    uStack_394 = uVar57;
    uStack_390 = uVar57;
    uStack_38c = uVar57;
    local_3a8 = uVar9;
    uStack_3a4 = uVar9;
    uStack_3a0 = uVar9;
    uStack_39c = uVar9;
    uVar65 = 0;
    fVar66 = *(float *)(ray + k * 4 + 0x30);
    local_2b8 = vsubps_avx(auVar4,auVar3);
    local_2c8 = vsubps_avx(auVar5,auVar4);
    local_2d8 = vsubps_avx(_local_298,auVar5);
    local_358 = vsubps_avx(_local_448,local_438);
    local_368 = vsubps_avx(_local_488,local_468);
    local_378 = vsubps_avx(_local_498,local_478);
    auVar131._4_4_ = fVar180;
    auVar131._0_4_ = fVar163;
    auVar131._8_4_ = fVar181;
    auVar131._12_4_ = fVar182;
    _local_388 = vsubps_avx(auVar131,local_458);
    auVar73 = ZEXT816(0x3f80000000000000);
    local_348 = auVar73;
LAB_017fccc9:
    auVar106 = vshufps_avx(auVar73,auVar73,0x50);
    auVar284._8_4_ = 0x3f800000;
    auVar284._0_8_ = 0x3f8000003f800000;
    auVar284._12_4_ = 0x3f800000;
    auVar289._16_4_ = 0x3f800000;
    auVar289._0_16_ = auVar284;
    auVar289._20_4_ = 0x3f800000;
    auVar289._24_4_ = 0x3f800000;
    auVar289._28_4_ = 0x3f800000;
    auVar135 = vsubps_avx(auVar284,auVar106);
    fVar69 = auVar106._0_4_;
    fVar138 = auVar22._0_4_;
    auVar74._0_4_ = fVar138 * fVar69;
    fVar92 = auVar106._4_4_;
    fVar148 = auVar22._4_4_;
    auVar74._4_4_ = fVar148 * fVar92;
    fVar203 = auVar106._8_4_;
    auVar74._8_4_ = fVar138 * fVar203;
    fVar124 = auVar106._12_4_;
    auVar74._12_4_ = fVar148 * fVar124;
    fVar248 = auVar215._0_4_;
    auVar175._0_4_ = fVar248 * fVar69;
    fVar260 = auVar215._4_4_;
    auVar175._4_4_ = fVar260 * fVar92;
    auVar175._8_4_ = fVar248 * fVar203;
    auVar175._12_4_ = fVar260 * fVar124;
    fVar202 = auVar7._0_4_;
    auVar140._0_4_ = fVar202 * fVar69;
    fVar212 = auVar7._4_4_;
    auVar140._4_4_ = fVar212 * fVar92;
    auVar140._8_4_ = fVar202 * fVar203;
    auVar140._12_4_ = fVar212 * fVar124;
    fVar213 = auVar94._0_4_;
    auVar115._0_4_ = fVar213 * fVar69;
    fVar229 = auVar94._4_4_;
    auVar115._4_4_ = fVar229 * fVar92;
    auVar115._8_4_ = fVar213 * fVar203;
    auVar115._12_4_ = fVar229 * fVar124;
    auVar70 = vfmadd231ps_fma(auVar74,auVar135,auVar186);
    auVar154 = vfmadd231ps_fma(auVar175,auVar135,auVar232);
    auVar131 = vfmadd231ps_fma(auVar140,auVar135,auVar251);
    auVar244 = vfmadd231ps_fma(auVar115,auVar265,auVar135);
    auVar106 = vmovshdup_avx(local_348);
    fVar69 = local_348._0_4_;
    fStack_140 = (auVar106._0_4_ - fVar69) * 0.04761905;
    auVar227._4_4_ = fVar69;
    auVar227._0_4_ = fVar69;
    auVar227._8_4_ = fVar69;
    auVar227._12_4_ = fVar69;
    auVar227._16_4_ = fVar69;
    auVar227._20_4_ = fVar69;
    auVar227._24_4_ = fVar69;
    auVar227._28_4_ = fVar69;
    auVar108._0_8_ = auVar106._0_8_;
    auVar108._8_8_ = auVar108._0_8_;
    auVar108._16_8_ = auVar108._0_8_;
    auVar108._24_8_ = auVar108._0_8_;
    auVar86 = vsubps_avx(auVar108,auVar227);
    uVar67 = auVar70._0_4_;
    auVar280._4_4_ = uVar67;
    auVar280._0_4_ = uVar67;
    auVar280._8_4_ = uVar67;
    auVar280._12_4_ = uVar67;
    auVar280._16_4_ = uVar67;
    auVar280._20_4_ = uVar67;
    auVar280._24_4_ = uVar67;
    auVar280._28_4_ = uVar67;
    auVar106 = vmovshdup_avx(auVar70);
    uVar93 = auVar106._0_8_;
    auVar273._8_8_ = uVar93;
    auVar273._0_8_ = uVar93;
    auVar273._16_8_ = uVar93;
    auVar273._24_8_ = uVar93;
    fVar230 = auVar154._0_4_;
    auVar256._4_4_ = fVar230;
    auVar256._0_4_ = fVar230;
    auVar256._8_4_ = fVar230;
    auVar256._12_4_ = fVar230;
    auVar256._16_4_ = fVar230;
    auVar256._20_4_ = fVar230;
    auVar256._24_4_ = fVar230;
    auVar256._28_4_ = fVar230;
    auVar135 = vmovshdup_avx(auVar154);
    auVar109._0_8_ = auVar135._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    fVar183 = auVar131._0_4_;
    auVar194._4_4_ = fVar183;
    auVar194._0_4_ = fVar183;
    auVar194._8_4_ = fVar183;
    auVar194._12_4_ = fVar183;
    auVar194._16_4_ = fVar183;
    auVar194._20_4_ = fVar183;
    auVar194._24_4_ = fVar183;
    auVar194._28_4_ = fVar183;
    auVar132 = vmovshdup_avx(auVar131);
    auVar210._0_8_ = auVar132._0_8_;
    auVar210._8_8_ = auVar210._0_8_;
    auVar210._16_8_ = auVar210._0_8_;
    auVar210._24_8_ = auVar210._0_8_;
    fVar91 = auVar244._0_4_;
    auVar6 = vmovshdup_avx(auVar244);
    auVar71 = vfmadd132ps_fma(auVar86,auVar227,_DAT_01faff20);
    auVar86 = vsubps_avx(auVar289,ZEXT1632(auVar71));
    fVar69 = auVar71._0_4_;
    fVar92 = auVar71._4_4_;
    auVar14._4_4_ = fVar230 * fVar92;
    auVar14._0_4_ = fVar230 * fVar69;
    fVar203 = auVar71._8_4_;
    auVar14._8_4_ = fVar230 * fVar203;
    fVar124 = auVar71._12_4_;
    auVar14._12_4_ = fVar230 * fVar124;
    auVar14._16_4_ = fVar230 * 0.0;
    auVar14._20_4_ = fVar230 * 0.0;
    auVar14._24_4_ = fVar230 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar71 = vfmadd231ps_fma(auVar14,auVar86,auVar280);
    fVar90 = auVar135._0_4_;
    fVar68 = auVar135._4_4_;
    auVar25._4_4_ = fVar68 * fVar92;
    auVar25._0_4_ = fVar90 * fVar69;
    auVar25._8_4_ = fVar90 * fVar203;
    auVar25._12_4_ = fVar68 * fVar124;
    auVar25._16_4_ = fVar90 * 0.0;
    auVar25._20_4_ = fVar68 * 0.0;
    auVar25._24_4_ = fVar90 * 0.0;
    auVar25._28_4_ = uVar67;
    auVar72 = vfmadd231ps_fma(auVar25,auVar86,auVar273);
    auVar26._4_4_ = fVar183 * fVar92;
    auVar26._0_4_ = fVar183 * fVar69;
    auVar26._8_4_ = fVar183 * fVar203;
    auVar26._12_4_ = fVar183 * fVar124;
    auVar26._16_4_ = fVar183 * 0.0;
    auVar26._20_4_ = fVar183 * 0.0;
    auVar26._24_4_ = fVar183 * 0.0;
    auVar26._28_4_ = auVar106._4_4_;
    auVar128 = vfmadd231ps_fma(auVar26,auVar86,auVar256);
    fVar90 = auVar132._0_4_;
    fVar68 = auVar132._4_4_;
    auVar27._4_4_ = fVar68 * fVar92;
    auVar27._0_4_ = fVar90 * fVar69;
    auVar27._8_4_ = fVar90 * fVar203;
    auVar27._12_4_ = fVar68 * fVar124;
    auVar27._16_4_ = fVar90 * 0.0;
    auVar27._20_4_ = fVar68 * 0.0;
    auVar27._24_4_ = fVar90 * 0.0;
    auVar27._28_4_ = fVar230;
    auVar95 = vfmadd231ps_fma(auVar27,auVar86,auVar109);
    auVar106 = vshufps_avx(auVar70,auVar70,0xaa);
    local_548._8_8_ = auVar106._0_8_;
    local_548._0_8_ = local_548._8_8_;
    local_548._16_8_ = local_548._8_8_;
    local_548._24_8_ = local_548._8_8_;
    auVar135 = vshufps_avx(auVar70,auVar70,0xff);
    uStack_5f0 = auVar135._0_8_;
    local_5f8 = (undefined1  [8])uStack_5f0;
    uStack_5e8 = uStack_5f0;
    uStack_5e0 = uStack_5f0;
    auVar28._4_4_ = fVar91 * fVar92;
    auVar28._0_4_ = fVar91 * fVar69;
    auVar28._8_4_ = fVar91 * fVar203;
    auVar28._12_4_ = fVar91 * fVar124;
    auVar28._16_4_ = fVar91 * 0.0;
    auVar28._20_4_ = fVar91 * 0.0;
    auVar28._24_4_ = fVar91 * 0.0;
    auVar28._28_4_ = fVar91;
    auVar70 = vfmadd231ps_fma(auVar28,auVar86,auVar194);
    auVar135 = vshufps_avx(auVar154,auVar154,0xaa);
    auVar195._0_8_ = auVar135._0_8_;
    auVar195._8_8_ = auVar195._0_8_;
    auVar195._16_8_ = auVar195._0_8_;
    auVar195._24_8_ = auVar195._0_8_;
    auVar132 = vshufps_avx(auVar154,auVar154,0xff);
    local_4e8._8_8_ = auVar132._0_8_;
    local_4e8._0_8_ = local_4e8._8_8_;
    local_4e8._16_8_ = local_4e8._8_8_;
    local_4e8._24_8_ = local_4e8._8_8_;
    fVar90 = auVar6._0_4_;
    fVar68 = auVar6._4_4_;
    auVar29._4_4_ = fVar68 * fVar92;
    auVar29._0_4_ = fVar90 * fVar69;
    auVar29._8_4_ = fVar90 * fVar203;
    auVar29._12_4_ = fVar68 * fVar124;
    auVar29._16_4_ = fVar90 * 0.0;
    auVar29._20_4_ = fVar68 * 0.0;
    auVar29._24_4_ = fVar90 * 0.0;
    auVar29._28_4_ = auVar106._4_4_;
    auVar96 = vfmadd231ps_fma(auVar29,auVar86,auVar210);
    auVar30._28_4_ = fVar68;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar128._12_4_ * fVar124,
                            CONCAT48(auVar128._8_4_ * fVar203,
                                     CONCAT44(auVar128._4_4_ * fVar92,auVar128._0_4_ * fVar69))));
    auVar71 = vfmadd231ps_fma(auVar30,auVar86,ZEXT1632(auVar71));
    fVar90 = auVar132._4_4_;
    auVar31._28_4_ = fVar90;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar95._12_4_ * fVar124,
                            CONCAT48(auVar95._8_4_ * fVar203,
                                     CONCAT44(auVar95._4_4_ * fVar92,auVar95._0_4_ * fVar69))));
    auVar72 = vfmadd231ps_fma(auVar31,auVar86,ZEXT1632(auVar72));
    auVar106 = vshufps_avx(auVar131,auVar131,0xaa);
    uVar93 = auVar106._0_8_;
    auVar179._8_8_ = uVar93;
    auVar179._0_8_ = uVar93;
    auVar179._16_8_ = uVar93;
    auVar179._24_8_ = uVar93;
    auVar6 = vshufps_avx(auVar131,auVar131,0xff);
    uVar93 = auVar6._0_8_;
    auVar290._8_8_ = uVar93;
    auVar290._0_8_ = uVar93;
    auVar290._16_8_ = uVar93;
    auVar290._24_8_ = uVar93;
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar70._12_4_ * fVar124,
                                                  CONCAT48(auVar70._8_4_ * fVar203,
                                                           CONCAT44(auVar70._4_4_ * fVar92,
                                                                    auVar70._0_4_ * fVar69)))),
                               auVar86,ZEXT1632(auVar128));
    auVar70 = vshufps_avx(auVar244,auVar244,0xaa);
    auVar154 = vshufps_avx(auVar244,auVar244,0xff);
    auVar244 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar96._12_4_,
                                                  CONCAT48(fVar203 * auVar96._8_4_,
                                                           CONCAT44(fVar92 * auVar96._4_4_,
                                                                    fVar69 * auVar96._0_4_)))),
                               auVar86,ZEXT1632(auVar95));
    auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar131._12_4_,
                                                  CONCAT48(fVar203 * auVar131._8_4_,
                                                           CONCAT44(fVar92 * auVar131._4_4_,
                                                                    fVar69 * auVar131._0_4_)))),
                               auVar86,ZEXT1632(auVar71));
    auVar14 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar71));
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar244._12_4_,
                                                  CONCAT48(fVar203 * auVar244._8_4_,
                                                           CONCAT44(fVar92 * auVar244._4_4_,
                                                                    fVar69 * auVar244._0_4_)))),
                               auVar86,ZEXT1632(auVar72));
    auVar15 = vsubps_avx(ZEXT1632(auVar244),ZEXT1632(auVar72));
    fVar68 = auVar15._28_4_;
    auVar257._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
    auVar257._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
    auVar257._8_4_ = fStack_140 * auVar14._8_4_ * 3.0;
    auVar257._12_4_ = fStack_140 * auVar14._12_4_ * 3.0;
    auVar257._16_4_ = fStack_140 * auVar14._16_4_ * 3.0;
    auVar257._20_4_ = fStack_140 * auVar14._20_4_ * 3.0;
    auVar257._24_4_ = fStack_140 * auVar14._24_4_ * 3.0;
    auVar257._28_4_ = 0;
    local_3f8._0_4_ = fStack_140 * auVar15._0_4_ * 3.0;
    local_3f8._4_4_ = fStack_140 * auVar15._4_4_ * 3.0;
    fStack_3f0 = fStack_140 * auVar15._8_4_ * 3.0;
    fStack_3ec = fStack_140 * auVar15._12_4_ * 3.0;
    fStack_3e8 = fStack_140 * auVar15._16_4_ * 3.0;
    fStack_3e4 = fStack_140 * auVar15._20_4_ * 3.0;
    fStack_3e0 = fStack_140 * auVar15._24_4_ * 3.0;
    fStack_3dc = fVar68;
    fVar91 = auVar135._0_4_;
    fVar183 = auVar135._4_4_;
    auVar32._4_4_ = fVar183 * fVar92;
    auVar32._0_4_ = fVar91 * fVar69;
    auVar32._8_4_ = fVar91 * fVar203;
    auVar32._12_4_ = fVar183 * fVar124;
    auVar32._16_4_ = fVar91 * 0.0;
    auVar32._20_4_ = fVar183 * 0.0;
    auVar32._24_4_ = fVar91 * 0.0;
    auVar32._28_4_ = fVar68;
    auVar135 = vfmadd231ps_fma(auVar32,auVar86,local_548);
    fVar91 = auVar132._0_4_;
    auVar33._4_4_ = fVar90 * fVar92;
    auVar33._0_4_ = fVar91 * fVar69;
    auVar33._8_4_ = fVar91 * fVar203;
    auVar33._12_4_ = fVar90 * fVar124;
    auVar33._16_4_ = fVar91 * 0.0;
    auVar33._20_4_ = fVar90 * 0.0;
    auVar33._24_4_ = fVar91 * 0.0;
    auVar33._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar33,auVar86,_local_5f8);
    fVar90 = auVar106._0_4_;
    fVar91 = auVar106._4_4_;
    auVar34._4_4_ = fVar91 * fVar92;
    auVar34._0_4_ = fVar90 * fVar69;
    auVar34._8_4_ = fVar90 * fVar203;
    auVar34._12_4_ = fVar91 * fVar124;
    auVar34._16_4_ = fVar90 * 0.0;
    auVar34._20_4_ = fVar91 * 0.0;
    auVar34._24_4_ = fVar90 * 0.0;
    auVar34._28_4_ = auVar14._28_4_;
    auVar106 = vfmadd231ps_fma(auVar34,auVar86,auVar195);
    fVar90 = auVar6._0_4_;
    fVar230 = auVar6._4_4_;
    auVar35._4_4_ = fVar230 * fVar92;
    auVar35._0_4_ = fVar90 * fVar69;
    auVar35._8_4_ = fVar90 * fVar203;
    auVar35._12_4_ = fVar230 * fVar124;
    auVar35._16_4_ = fVar90 * 0.0;
    auVar35._20_4_ = fVar230 * 0.0;
    auVar35._24_4_ = fVar90 * 0.0;
    auVar35._28_4_ = fVar183;
    auVar6 = vfmadd231ps_fma(auVar35,auVar86,local_4e8);
    local_4e8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar128));
    fVar90 = auVar70._0_4_;
    fVar91 = auVar70._4_4_;
    auVar36._4_4_ = fVar91 * fVar92;
    auVar36._0_4_ = fVar90 * fVar69;
    auVar36._8_4_ = fVar90 * fVar203;
    auVar36._12_4_ = fVar91 * fVar124;
    auVar36._16_4_ = fVar90 * 0.0;
    auVar36._20_4_ = fVar91 * 0.0;
    auVar36._24_4_ = fVar90 * 0.0;
    auVar36._28_4_ = fVar91;
    auVar70 = vfmadd231ps_fma(auVar36,auVar86,auVar179);
    auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar131));
    fVar90 = auVar154._0_4_;
    fVar91 = auVar154._4_4_;
    auVar37._4_4_ = fVar91 * fVar92;
    auVar37._0_4_ = fVar90 * fVar69;
    auVar37._8_4_ = fVar90 * fVar203;
    auVar37._12_4_ = fVar91 * fVar124;
    auVar37._16_4_ = fVar90 * 0.0;
    auVar37._20_4_ = fVar91 * 0.0;
    auVar37._24_4_ = fVar90 * 0.0;
    auVar37._28_4_ = fVar91;
    auVar154 = vfmadd231ps_fma(auVar37,auVar86,auVar290);
    auVar38._28_4_ = fVar230;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar106._12_4_ * fVar124,
                            CONCAT48(auVar106._8_4_ * fVar203,
                                     CONCAT44(auVar106._4_4_ * fVar92,auVar106._0_4_ * fVar69))));
    auVar135 = vfmadd231ps_fma(auVar38,auVar86,ZEXT1632(auVar135));
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar6._12_4_,
                                                  CONCAT48(fVar203 * auVar6._8_4_,
                                                           CONCAT44(fVar92 * auVar6._4_4_,
                                                                    fVar69 * auVar6._0_4_)))),
                               auVar86,ZEXT1632(auVar132));
    auVar110._0_4_ = auVar128._0_4_ + auVar257._0_4_;
    auVar110._4_4_ = auVar128._4_4_ + auVar257._4_4_;
    auVar110._8_4_ = auVar128._8_4_ + auVar257._8_4_;
    auVar110._12_4_ = auVar128._12_4_ + auVar257._12_4_;
    auVar110._16_4_ = auVar257._16_4_ + 0.0;
    auVar110._20_4_ = auVar257._20_4_ + 0.0;
    auVar110._24_4_ = auVar257._24_4_ + 0.0;
    auVar110._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar70._12_4_ * fVar124,
                                                  CONCAT48(auVar70._8_4_ * fVar203,
                                                           CONCAT44(auVar70._4_4_ * fVar92,
                                                                    auVar70._0_4_ * fVar69)))),
                               auVar86,ZEXT1632(auVar106));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar154._12_4_ * fVar124,
                                                CONCAT48(auVar154._8_4_ * fVar203,
                                                         CONCAT44(auVar154._4_4_ * fVar92,
                                                                  auVar154._0_4_ * fVar69)))),
                             auVar86,ZEXT1632(auVar6));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar106._12_4_,
                                                 CONCAT48(fVar203 * auVar106._8_4_,
                                                          CONCAT44(fVar92 * auVar106._4_4_,
                                                                   fVar69 * auVar106._0_4_)))),
                              auVar86,ZEXT1632(auVar135));
    auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar124,
                                                  CONCAT48(auVar6._8_4_ * fVar203,
                                                           CONCAT44(auVar6._4_4_ * fVar92,
                                                                    auVar6._0_4_ * fVar69)))),
                               ZEXT1632(auVar132),auVar86);
    auVar86 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar135));
    auVar14 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar132));
    auVar281._0_4_ = fStack_140 * auVar86._0_4_ * 3.0;
    auVar281._4_4_ = fStack_140 * auVar86._4_4_ * 3.0;
    auVar281._8_4_ = fStack_140 * auVar86._8_4_ * 3.0;
    auVar281._12_4_ = fStack_140 * auVar86._12_4_ * 3.0;
    auVar281._16_4_ = fStack_140 * auVar86._16_4_ * 3.0;
    auVar281._20_4_ = fStack_140 * auVar86._20_4_ * 3.0;
    auVar281._24_4_ = fStack_140 * auVar86._24_4_ * 3.0;
    auVar281._28_4_ = 0;
    local_158 = fStack_140 * auVar14._0_4_ * 3.0;
    fStack_154 = fStack_140 * auVar14._4_4_ * 3.0;
    auVar39._4_4_ = fStack_154;
    auVar39._0_4_ = local_158;
    fStack_150 = fStack_140 * auVar14._8_4_ * 3.0;
    auVar39._8_4_ = fStack_150;
    fStack_14c = fStack_140 * auVar14._12_4_ * 3.0;
    auVar39._12_4_ = fStack_14c;
    fStack_148 = fStack_140 * auVar14._16_4_ * 3.0;
    auVar39._16_4_ = fStack_148;
    fStack_144 = fStack_140 * auVar14._20_4_ * 3.0;
    auVar39._20_4_ = fStack_144;
    fStack_140 = fStack_140 * auVar14._24_4_ * 3.0;
    auVar39._24_4_ = fStack_140;
    auVar39._28_4_ = 0x40400000;
    _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar70));
    _local_3c8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar154));
    auVar86 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar128));
    auVar14 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar131));
    auVar15 = vsubps_avx(_local_508,local_4e8);
    fVar261 = auVar86._0_4_ + auVar15._0_4_;
    fVar262 = auVar86._4_4_ + auVar15._4_4_;
    fVar197 = auVar86._8_4_ + auVar15._8_4_;
    fVar198 = auVar86._12_4_ + auVar15._12_4_;
    fVar199 = auVar86._16_4_ + auVar15._16_4_;
    fVar200 = auVar86._20_4_ + auVar15._20_4_;
    fVar201 = auVar86._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(_local_3c8,auVar18);
    auVar87._0_4_ = auVar14._0_4_ + auVar16._0_4_;
    auVar87._4_4_ = auVar14._4_4_ + auVar16._4_4_;
    auVar87._8_4_ = auVar14._8_4_ + auVar16._8_4_;
    auVar87._12_4_ = auVar14._12_4_ + auVar16._12_4_;
    auVar87._16_4_ = auVar14._16_4_ + auVar16._16_4_;
    auVar87._20_4_ = auVar14._20_4_ + auVar16._20_4_;
    auVar87._24_4_ = auVar14._24_4_ + auVar16._24_4_;
    auVar87._28_4_ = auVar14._28_4_ + auVar16._28_4_;
    local_f8 = ZEXT1632(auVar131);
    fVar69 = auVar131._0_4_;
    local_178 = (float)local_3f8._0_4_ + fVar69;
    fVar92 = auVar131._4_4_;
    fStack_174 = (float)local_3f8._4_4_ + fVar92;
    fVar203 = auVar131._8_4_;
    fStack_170 = fStack_3f0 + fVar203;
    fVar124 = auVar131._12_4_;
    fStack_16c = fStack_3ec + fVar124;
    fStack_168 = fStack_3e8 + 0.0;
    fStack_164 = fStack_3e4 + 0.0;
    fStack_160 = fStack_3e0 + 0.0;
    local_b8 = ZEXT1632(auVar128);
    auVar14 = vsubps_avx(local_b8,auVar257);
    local_d8 = vpermps_avx2(_DAT_01fec480,auVar14);
    auVar14 = vsubps_avx(local_f8,_local_3f8);
    local_198 = vpermps_avx2(_DAT_01fec480,auVar14);
    local_118._0_4_ = auVar70._0_4_ + auVar281._0_4_;
    local_118._4_4_ = auVar70._4_4_ + auVar281._4_4_;
    local_118._8_4_ = auVar70._8_4_ + auVar281._8_4_;
    local_118._12_4_ = auVar70._12_4_ + auVar281._12_4_;
    local_118._16_4_ = auVar281._16_4_ + 0.0;
    local_118._20_4_ = auVar281._20_4_ + 0.0;
    local_118._24_4_ = auVar281._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar228 = ZEXT3264(local_118);
    auVar258 = ZEXT1632(auVar70);
    auVar14 = vsubps_avx(auVar258,auVar281);
    _local_3f8 = vpermps_avx2(_DAT_01fec480,auVar14);
    fVar90 = auVar154._0_4_;
    local_158 = fVar90 + local_158;
    fVar91 = auVar154._4_4_;
    fStack_154 = fVar91 + fStack_154;
    fVar183 = auVar154._8_4_;
    fStack_150 = fVar183 + fStack_150;
    fVar230 = auVar154._12_4_;
    fStack_14c = fVar230 + fStack_14c;
    fStack_148 = fStack_148 + 0.0;
    fStack_144 = fStack_144 + 0.0;
    fStack_140 = fStack_140 + 0.0;
    auVar14 = vsubps_avx(ZEXT1632(auVar154),auVar39);
    local_138 = vpermps_avx2(_DAT_01fec480,auVar14);
    auVar40._4_4_ = fVar92 * fVar262;
    auVar40._0_4_ = fVar69 * fVar261;
    auVar40._8_4_ = fVar203 * fVar197;
    auVar40._12_4_ = fVar124 * fVar198;
    auVar40._16_4_ = fVar199 * 0.0;
    auVar40._20_4_ = fVar200 * 0.0;
    auVar40._24_4_ = fVar201 * 0.0;
    auVar40._28_4_ = auVar14._28_4_;
    auVar106 = vfnmadd231ps_fma(auVar40,local_b8,auVar87);
    fStack_15c = fVar68 + 0.0;
    auVar41._4_4_ = fStack_174 * fVar262;
    auVar41._0_4_ = local_178 * fVar261;
    auVar41._8_4_ = fStack_170 * fVar197;
    auVar41._12_4_ = fStack_16c * fVar198;
    auVar41._16_4_ = fStack_168 * fVar199;
    auVar41._20_4_ = fStack_164 * fVar200;
    auVar41._24_4_ = fStack_160 * fVar201;
    auVar41._28_4_ = 0;
    auVar135 = vfnmadd231ps_fma(auVar41,auVar87,auVar110);
    auVar42._4_4_ = local_198._4_4_ * fVar262;
    auVar42._0_4_ = local_198._0_4_ * fVar261;
    auVar42._8_4_ = local_198._8_4_ * fVar197;
    auVar42._12_4_ = local_198._12_4_ * fVar198;
    auVar42._16_4_ = local_198._16_4_ * fVar199;
    auVar42._20_4_ = local_198._20_4_ * fVar200;
    auVar42._24_4_ = local_198._24_4_ * fVar201;
    auVar42._28_4_ = fVar68 + 0.0;
    auVar132 = vfnmadd231ps_fma(auVar42,local_d8,auVar87);
    local_5f8._0_4_ = auVar18._0_4_;
    local_5f8._4_4_ = auVar18._4_4_;
    uStack_5f0._0_4_ = auVar18._8_4_;
    uStack_5f0._4_4_ = auVar18._12_4_;
    uStack_5e8._0_4_ = auVar18._16_4_;
    uStack_5e8._4_4_ = auVar18._20_4_;
    uStack_5e0._0_4_ = auVar18._24_4_;
    uStack_5e0._4_4_ = auVar18._28_4_;
    auVar43._4_4_ = (float)local_5f8._4_4_ * fVar262;
    auVar43._0_4_ = (float)local_5f8._0_4_ * fVar261;
    auVar43._8_4_ = (float)uStack_5f0 * fVar197;
    auVar43._12_4_ = uStack_5f0._4_4_ * fVar198;
    auVar43._16_4_ = (float)uStack_5e8 * fVar199;
    auVar43._20_4_ = uStack_5e8._4_4_ * fVar200;
    auVar43._24_4_ = (float)uStack_5e0 * fVar201;
    auVar43._28_4_ = uStack_5e0._4_4_;
    auVar6 = vfnmadd231ps_fma(auVar43,local_4e8,auVar87);
    auVar211._0_4_ = fVar90 * fVar261;
    auVar211._4_4_ = fVar91 * fVar262;
    auVar211._8_4_ = fVar183 * fVar197;
    auVar211._12_4_ = fVar230 * fVar198;
    auVar211._16_4_ = fVar199 * 0.0;
    auVar211._20_4_ = fVar200 * 0.0;
    auVar211._24_4_ = fVar201 * 0.0;
    auVar211._28_4_ = 0;
    auVar70 = vfnmadd231ps_fma(auVar211,auVar258,auVar87);
    uStack_13c = 0x40400000;
    auVar44._4_4_ = fStack_154 * fVar262;
    auVar44._0_4_ = local_158 * fVar261;
    auVar44._8_4_ = fStack_150 * fVar197;
    auVar44._12_4_ = fStack_14c * fVar198;
    auVar44._16_4_ = fStack_148 * fVar199;
    auVar44._20_4_ = fStack_144 * fVar200;
    auVar44._24_4_ = fStack_140 * fVar201;
    auVar44._28_4_ = local_4e8._28_4_;
    auVar131 = vfnmadd231ps_fma(auVar44,local_118,auVar87);
    auVar45._4_4_ = local_138._4_4_ * fVar262;
    auVar45._0_4_ = local_138._0_4_ * fVar261;
    auVar45._8_4_ = local_138._8_4_ * fVar197;
    auVar45._12_4_ = local_138._12_4_ * fVar198;
    auVar45._16_4_ = local_138._16_4_ * fVar199;
    auVar45._20_4_ = local_138._20_4_ * fVar200;
    auVar45._24_4_ = local_138._24_4_ * fVar201;
    auVar45._28_4_ = local_138._28_4_;
    auVar244 = vfnmadd231ps_fma(auVar45,_local_3f8,auVar87);
    auVar46._4_4_ = local_3c8._4_4_ * fVar262;
    auVar46._0_4_ = local_3c8._0_4_ * fVar261;
    auVar46._8_4_ = local_3c8._8_4_ * fVar197;
    auVar46._12_4_ = local_3c8._12_4_ * fVar198;
    auVar46._16_4_ = local_3c8._16_4_ * fVar199;
    auVar46._20_4_ = local_3c8._20_4_ * fVar200;
    auVar46._24_4_ = local_3c8._24_4_ * fVar201;
    auVar46._28_4_ = auVar86._28_4_ + auVar15._28_4_;
    auVar71 = vfnmadd231ps_fma(auVar46,_local_508,auVar87);
    auVar14 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar135));
    auVar86 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar135));
    auVar15 = vminps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
    auVar86 = vmaxps_avx(auVar86,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar131));
    auVar14 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar131));
    auVar17 = vminps_avx(ZEXT1632(auVar244),ZEXT1632(auVar71));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar244),ZEXT1632(auVar71));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar86,auVar14);
    auVar56._4_4_ = fStack_74;
    auVar56._0_4_ = local_78;
    auVar56._8_4_ = fStack_70;
    auVar56._12_4_ = fStack_6c;
    auVar56._16_4_ = fStack_68;
    auVar56._20_4_ = fStack_64;
    auVar56._24_4_ = fStack_60;
    auVar56._28_4_ = fStack_5c;
    auVar86 = vcmpps_avx(auVar16,auVar56,2);
    auVar55._4_4_ = fStack_94;
    auVar55._0_4_ = local_98;
    auVar55._8_4_ = fStack_90;
    auVar55._12_4_ = fStack_8c;
    auVar55._16_4_ = fStack_88;
    auVar55._20_4_ = fStack_84;
    auVar55._24_4_ = fStack_80;
    auVar55._28_4_ = fStack_7c;
    auVar14 = vcmpps_avx(auVar14,auVar55,5);
    auVar86 = vandps_avx(auVar14,auVar86);
    auVar14 = local_1b8 & auVar86;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_4e8,local_b8);
      auVar15 = vsubps_avx(_local_508,auVar258);
      fVar261 = auVar14._0_4_ + auVar15._0_4_;
      fVar262 = auVar14._4_4_ + auVar15._4_4_;
      fVar197 = auVar14._8_4_ + auVar15._8_4_;
      fVar198 = auVar14._12_4_ + auVar15._12_4_;
      fVar199 = auVar14._16_4_ + auVar15._16_4_;
      fVar200 = auVar14._20_4_ + auVar15._20_4_;
      fVar201 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(auVar18,local_f8);
      auVar17 = vsubps_avx(_local_3c8,ZEXT1632(auVar154));
      auVar111._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar111._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar111._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar111._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar111._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar111._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar111._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar68 = auVar17._28_4_;
      auVar111._28_4_ = auVar16._28_4_ + fVar68;
      auVar47._4_4_ = fVar92 * fVar262;
      auVar47._0_4_ = fVar69 * fVar261;
      auVar47._8_4_ = fVar203 * fVar197;
      auVar47._12_4_ = fVar124 * fVar198;
      auVar47._16_4_ = fVar199 * 0.0;
      auVar47._20_4_ = fVar200 * 0.0;
      auVar47._24_4_ = fVar201 * 0.0;
      auVar47._28_4_ = local_508._28_4_;
      auVar70 = vfnmadd231ps_fma(auVar47,auVar111,local_b8);
      auVar48._4_4_ = fVar262 * fStack_174;
      auVar48._0_4_ = fVar261 * local_178;
      auVar48._8_4_ = fVar197 * fStack_170;
      auVar48._12_4_ = fVar198 * fStack_16c;
      auVar48._16_4_ = fVar199 * fStack_168;
      auVar48._20_4_ = fVar200 * fStack_164;
      auVar48._24_4_ = fVar201 * fStack_160;
      auVar48._28_4_ = 0;
      auVar106 = vfnmadd213ps_fma(auVar110,auVar111,auVar48);
      auVar49._4_4_ = fVar262 * local_198._4_4_;
      auVar49._0_4_ = fVar261 * local_198._0_4_;
      auVar49._8_4_ = fVar197 * local_198._8_4_;
      auVar49._12_4_ = fVar198 * local_198._12_4_;
      auVar49._16_4_ = fVar199 * local_198._16_4_;
      auVar49._20_4_ = fVar200 * local_198._20_4_;
      auVar49._24_4_ = fVar201 * local_198._24_4_;
      auVar49._28_4_ = 0;
      auVar135 = vfnmadd213ps_fma(local_d8,auVar111,auVar49);
      auVar50._4_4_ = (float)local_5f8._4_4_ * fVar262;
      auVar50._0_4_ = (float)local_5f8._0_4_ * fVar261;
      auVar50._8_4_ = (float)uStack_5f0 * fVar197;
      auVar50._12_4_ = uStack_5f0._4_4_ * fVar198;
      auVar50._16_4_ = (float)uStack_5e8 * fVar199;
      auVar50._20_4_ = uStack_5e8._4_4_ * fVar200;
      auVar50._24_4_ = (float)uStack_5e0 * fVar201;
      auVar50._28_4_ = 0;
      auVar154 = vfnmadd231ps_fma(auVar50,auVar111,local_4e8);
      auVar136._0_4_ = fVar90 * fVar261;
      auVar136._4_4_ = fVar91 * fVar262;
      auVar136._8_4_ = fVar183 * fVar197;
      auVar136._12_4_ = fVar230 * fVar198;
      auVar136._16_4_ = fVar199 * 0.0;
      auVar136._20_4_ = fVar200 * 0.0;
      auVar136._24_4_ = fVar201 * 0.0;
      auVar136._28_4_ = 0;
      auVar131 = vfnmadd231ps_fma(auVar136,auVar111,auVar258);
      auVar51._4_4_ = fVar262 * fStack_154;
      auVar51._0_4_ = fVar261 * local_158;
      auVar51._8_4_ = fVar197 * fStack_150;
      auVar51._12_4_ = fVar198 * fStack_14c;
      auVar51._16_4_ = fVar199 * fStack_148;
      auVar51._20_4_ = fVar200 * fStack_144;
      auVar51._24_4_ = fVar201 * fStack_140;
      auVar51._28_4_ = fVar68;
      auVar132 = vfnmadd213ps_fma(local_118,auVar111,auVar51);
      auVar52._4_4_ = fVar262 * local_138._4_4_;
      auVar52._0_4_ = fVar261 * local_138._0_4_;
      auVar52._8_4_ = fVar197 * local_138._8_4_;
      auVar52._12_4_ = fVar198 * local_138._12_4_;
      auVar52._16_4_ = fVar199 * local_138._16_4_;
      auVar52._20_4_ = fVar200 * local_138._20_4_;
      auVar52._24_4_ = fVar201 * local_138._24_4_;
      auVar52._28_4_ = fVar68;
      auVar6 = vfnmadd213ps_fma(_local_3f8,auVar111,auVar52);
      auVar228 = ZEXT1664(auVar6);
      auVar53._4_4_ = fVar262 * local_3c8._4_4_;
      auVar53._0_4_ = fVar261 * local_3c8._0_4_;
      auVar53._8_4_ = fVar197 * local_3c8._8_4_;
      auVar53._12_4_ = fVar198 * local_3c8._12_4_;
      auVar53._16_4_ = fVar199 * local_3c8._16_4_;
      auVar53._20_4_ = fVar200 * local_3c8._20_4_;
      auVar53._24_4_ = fVar201 * local_3c8._24_4_;
      auVar53._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar244 = vfnmadd231ps_fma(auVar53,auVar111,_local_508);
      auVar15 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar106));
      auVar14 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar106));
      auVar16 = vminps_avx(ZEXT1632(auVar135),ZEXT1632(auVar154));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar135),ZEXT1632(auVar154));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar132));
      auVar15 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar132));
      auVar18 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar244));
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar244));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,auVar56,2);
      auVar15 = vcmpps_avx(auVar15,auVar55,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar86 = vandps_avx(auVar86,local_1b8);
      auVar15 = auVar86 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar86 = vandps_avx(auVar14,auVar86);
        uVar62 = vmovmskps_avx(auVar86);
        if (uVar62 != 0) {
          uVar64 = (ulong)uVar65;
          auStack_3d8[uVar64] = uVar62 & 0xff;
          uVar93 = vmovlps_avx(local_348);
          *(undefined8 *)(&uStack_288 + uVar64 * 2) = uVar93;
          uVar58 = vmovlps_avx(auVar73);
          auStack_58[uVar64] = uVar58;
          uVar65 = uVar65 + 1;
        }
      }
    }
    auVar259 = ZEXT464(0x3f800000);
    if (uVar65 != 0) {
      do {
        uVar64 = (ulong)(uVar65 - 1);
        uVar61 = auStack_3d8[uVar64];
        uVar62 = (&uStack_288)[uVar64 * 2];
        fVar69 = afStack_284[uVar64 * 2];
        iVar21 = 0;
        for (uVar58 = (ulong)uVar61; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          iVar21 = iVar21 + 1;
        }
        uVar61 = uVar61 - 1 & uVar61;
        if (uVar61 == 0) {
          uVar65 = uVar65 - 1;
        }
        auVar73._8_8_ = 0;
        auVar73._0_8_ = auStack_58[uVar64];
        auStack_3d8[uVar64] = uVar61;
        fVar92 = (float)(iVar21 + 1) * 0.14285715;
        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * (float)iVar21 * 0.14285715)),
                                   ZEXT416(uVar62),
                                   ZEXT416((uint)(auVar259._0_4_ - (float)iVar21 * 0.14285715)));
        auVar135 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * fVar92)),ZEXT416(uVar62),
                                   ZEXT416((uint)(auVar259._0_4_ - fVar92)));
        fVar92 = auVar135._0_4_;
        fVar203 = auVar106._0_4_;
        fVar69 = fVar92 - fVar203;
        if (0.16666667 <= fVar69) {
          local_348 = vinsertps_avx(auVar106,auVar135,0x10);
          goto LAB_017fccc9;
        }
        auVar132 = vshufps_avx(auVar73,auVar73,0x50);
        auVar97._8_4_ = 0x3f800000;
        auVar97._0_8_ = 0x3f8000003f800000;
        auVar97._12_4_ = 0x3f800000;
        auVar6 = vsubps_avx(auVar97,auVar132);
        fVar124 = auVar132._0_4_;
        auVar141._0_4_ = fVar124 * fVar138;
        fVar90 = auVar132._4_4_;
        auVar141._4_4_ = fVar90 * fVar148;
        fVar68 = auVar132._8_4_;
        auVar141._8_4_ = fVar68 * fVar138;
        fVar91 = auVar132._12_4_;
        auVar141._12_4_ = fVar91 * fVar148;
        auVar152._0_4_ = fVar124 * fVar248;
        auVar152._4_4_ = fVar90 * fVar260;
        auVar152._8_4_ = fVar68 * fVar248;
        auVar152._12_4_ = fVar91 * fVar260;
        auVar176._0_4_ = fVar124 * fVar202;
        auVar176._4_4_ = fVar90 * fVar212;
        auVar176._8_4_ = fVar68 * fVar202;
        auVar176._12_4_ = fVar91 * fVar212;
        auVar75._0_4_ = fVar124 * fVar213;
        auVar75._4_4_ = fVar90 * fVar229;
        auVar75._8_4_ = fVar68 * fVar213;
        auVar75._12_4_ = fVar91 * fVar229;
        auVar132 = vfmadd231ps_fma(auVar141,auVar6,auVar186);
        auVar70 = vfmadd231ps_fma(auVar152,auVar6,auVar232);
        auVar154 = vfmadd231ps_fma(auVar176,auVar6,auVar251);
        auVar6 = vfmadd231ps_fma(auVar75,auVar6,auVar265);
        auVar137._16_16_ = auVar132;
        auVar137._0_16_ = auVar132;
        auVar147._16_16_ = auVar70;
        auVar147._0_16_ = auVar70;
        auVar162._16_16_ = auVar154;
        auVar162._0_16_ = auVar154;
        auVar196._4_4_ = fVar203;
        auVar196._0_4_ = fVar203;
        auVar196._8_4_ = fVar203;
        auVar196._12_4_ = fVar203;
        auVar196._20_4_ = fVar92;
        auVar196._16_4_ = fVar92;
        auVar196._24_4_ = fVar92;
        auVar196._28_4_ = fVar92;
        auVar86 = vsubps_avx(auVar147,auVar137);
        auVar70 = vfmadd213ps_fma(auVar86,auVar196,auVar137);
        auVar86 = vsubps_avx(auVar162,auVar147);
        auVar131 = vfmadd213ps_fma(auVar86,auVar196,auVar147);
        auVar132 = vsubps_avx(auVar6,auVar154);
        auVar88._16_16_ = auVar132;
        auVar88._0_16_ = auVar132;
        auVar132 = vfmadd213ps_fma(auVar88,auVar196,auVar162);
        auVar86 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar70));
        auVar6 = vfmadd213ps_fma(auVar86,auVar196,ZEXT1632(auVar70));
        auVar86 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar131));
        auVar132 = vfmadd213ps_fma(auVar86,auVar196,ZEXT1632(auVar131));
        auVar86 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar86,auVar196);
        fVar230 = auVar86._4_4_ * 3.0;
        local_4e8._0_4_ = fVar69;
        fVar124 = fVar69 * 0.33333334;
        auVar187._0_8_ =
             CONCAT44(auVar71._4_4_ + fVar124 * fVar230,
                      auVar71._0_4_ + fVar124 * auVar86._0_4_ * 3.0);
        auVar187._8_4_ = auVar71._8_4_ + fVar124 * auVar86._8_4_ * 3.0;
        auVar187._12_4_ = auVar71._12_4_ + fVar124 * auVar86._12_4_ * 3.0;
        _local_3c8 = vshufpd_avx(auVar71,auVar71,3);
        auVar6 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar132 = vsubps_avx(_local_3c8,auVar71);
        _local_508 = auVar6;
        auVar70 = vsubps_avx(auVar6,(undefined1  [16])0x0);
        auVar76._0_4_ = auVar132._0_4_ + auVar70._0_4_;
        auVar76._4_4_ = auVar132._4_4_ + auVar70._4_4_;
        auVar76._8_4_ = auVar132._8_4_ + auVar70._8_4_;
        auVar76._12_4_ = auVar132._12_4_ + auVar70._12_4_;
        auVar132 = vshufps_avx(auVar71,auVar71,0xb1);
        auVar70 = vshufps_avx(auVar187,auVar187,0xb1);
        auVar275._4_4_ = auVar76._0_4_;
        auVar275._0_4_ = auVar76._0_4_;
        auVar275._8_4_ = auVar76._0_4_;
        auVar275._12_4_ = auVar76._0_4_;
        auVar154 = vshufps_avx(auVar76,auVar76,0x55);
        fVar90 = auVar154._0_4_;
        auVar77._0_4_ = fVar90 * auVar132._0_4_;
        fVar68 = auVar154._4_4_;
        auVar77._4_4_ = fVar68 * auVar132._4_4_;
        fVar91 = auVar154._8_4_;
        auVar77._8_4_ = fVar91 * auVar132._8_4_;
        fVar183 = auVar154._12_4_;
        auVar77._12_4_ = fVar183 * auVar132._12_4_;
        auVar153._0_4_ = fVar90 * auVar70._0_4_;
        auVar153._4_4_ = fVar68 * auVar70._4_4_;
        auVar153._8_4_ = fVar91 * auVar70._8_4_;
        auVar153._12_4_ = fVar183 * auVar70._12_4_;
        auVar131 = vfmadd231ps_fma(auVar77,auVar275,auVar71);
        _local_3f8 = auVar187;
        auVar244 = vfmadd231ps_fma(auVar153,auVar275,auVar187);
        auVar70 = vshufps_avx(auVar131,auVar131,0xe8);
        auVar154 = vshufps_avx(auVar244,auVar244,0xe8);
        auVar132 = vcmpps_avx(auVar70,auVar154,1);
        uVar62 = vextractps_avx(auVar132,0);
        auVar72 = auVar244;
        if ((uVar62 & 1) == 0) {
          auVar72 = auVar131;
        }
        auVar127._0_4_ = fVar124 * auVar86._16_4_ * 3.0;
        auVar127._4_4_ = fVar124 * fVar230;
        auVar127._8_4_ = fVar124 * auVar86._24_4_ * 3.0;
        auVar127._12_4_ = fVar124 * auVar228._28_4_;
        auVar113 = vsubps_avx((undefined1  [16])0x0,auVar127);
        auVar128 = vshufps_avx(auVar113,auVar113,0xb1);
        auVar95 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar188._0_4_ = fVar90 * auVar128._0_4_;
        auVar188._4_4_ = fVar68 * auVar128._4_4_;
        auVar188._8_4_ = fVar91 * auVar128._8_4_;
        auVar188._12_4_ = fVar183 * auVar128._12_4_;
        auVar207._0_4_ = auVar95._0_4_ * fVar90;
        auVar207._4_4_ = auVar95._4_4_ * fVar68;
        auVar207._8_4_ = auVar95._8_4_ * fVar91;
        auVar207._12_4_ = auVar95._12_4_ * fVar183;
        auVar114 = vfmadd231ps_fma(auVar188,auVar275,auVar113);
        auVar125 = vfmadd231ps_fma(auVar207,(undefined1  [16])0x0,auVar275);
        auVar95 = vshufps_avx(auVar114,auVar114,0xe8);
        auVar96 = vshufps_avx(auVar125,auVar125,0xe8);
        auVar228 = ZEXT1664(auVar96);
        auVar128 = vcmpps_avx(auVar95,auVar96,1);
        uVar62 = vextractps_avx(auVar128,0);
        auVar126 = auVar125;
        if ((uVar62 & 1) == 0) {
          auVar126 = auVar114;
        }
        auVar72 = vmaxss_avx(auVar126,auVar72);
        auVar70 = vminps_avx(auVar70,auVar154);
        auVar154 = vminps_avx(auVar95,auVar96);
        auVar154 = vminps_avx(auVar70,auVar154);
        auVar132 = vshufps_avx(auVar132,auVar132,0x55);
        auVar132 = vblendps_avx(auVar132,auVar128,2);
        auVar128 = vpslld_avx(auVar132,0x1f);
        auVar132 = vshufpd_avx(auVar244,auVar244,1);
        auVar132 = vinsertps_avx(auVar132,auVar125,0x9c);
        auVar70 = vshufpd_avx(auVar131,auVar131,1);
        auVar70 = vinsertps_avx(auVar70,auVar114,0x9c);
        auVar132 = vblendvps_avx(auVar70,auVar132,auVar128);
        auVar70 = vmovshdup_avx(auVar132);
        auVar132 = vmaxss_avx(auVar70,auVar132);
        fVar91 = auVar154._0_4_;
        auVar70 = vmovshdup_avx(auVar154);
        auVar259 = ZEXT464(0x3f800000);
        fVar68 = auVar132._0_4_;
        fVar124 = auVar70._0_4_;
        fVar90 = auVar72._0_4_;
        if (((fVar91 < 0.0001) && (-0.0001 < fVar68)) || (fVar124 < 0.0001 && -0.0001 < fVar68)) {
LAB_017fd575:
          auVar131 = vcmpps_avx(auVar154,_DAT_01f7aa10,1);
          auVar244 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar70 = vcmpss_avx(auVar72,ZEXT816(0) << 0x20,1);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar116._8_4_ = 0xbf800000;
          auVar116._0_8_ = 0xbf800000bf800000;
          auVar116._12_4_ = 0xbf800000;
          auVar70 = vblendvps_avx(auVar98,auVar116,auVar70);
          auVar131 = vblendvps_avx(auVar98,auVar116,auVar131);
          fVar230 = auVar131._0_4_;
          fVar183 = auVar70._0_4_;
          auVar70 = SUB6416(ZEXT864(0),0);
          if ((fVar230 == fVar183) && (!NAN(fVar230) && !NAN(fVar183))) {
            auVar70 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar230 == fVar183) && (!NAN(fVar230) && !NAN(fVar183))) {
            auVar244 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar131 = vmovshdup_avx(auVar131);
          fVar261 = auVar131._0_4_;
          if ((fVar230 != fVar261) || (NAN(fVar230) || NAN(fVar261))) {
            if ((fVar124 != fVar91) || (NAN(fVar124) || NAN(fVar91))) {
              auVar129._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
              auVar129._8_4_ = auVar154._8_4_ ^ 0x80000000;
              auVar129._12_4_ = auVar154._12_4_ ^ 0x80000000;
              auVar130._0_4_ = -fVar91 / (fVar124 - fVar91);
              auVar130._4_12_ = auVar129._4_12_;
              auVar154 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
              auVar131 = auVar154;
            }
            else {
              auVar154 = ZEXT816(0) << 0x20;
              if ((fVar91 != 0.0) || (auVar131 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar91))) {
                auVar154 = SUB6416(ZEXT464(0x7f800000),0);
                auVar131 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar70 = vminss_avx(auVar70,auVar154);
            auVar244 = vmaxss_avx(auVar131,auVar244);
          }
          auVar132 = vcmpss_avx(auVar132,ZEXT416(0),1);
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar117._8_4_ = 0xbf800000;
          auVar117._0_8_ = 0xbf800000bf800000;
          auVar117._12_4_ = 0xbf800000;
          auVar132 = vblendvps_avx(auVar99,auVar117,auVar132);
          fVar124 = auVar132._0_4_;
          if ((fVar183 != fVar124) || (NAN(fVar183) || NAN(fVar124))) {
            if ((fVar68 != fVar90) || (NAN(fVar68) || NAN(fVar90))) {
              auVar78._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar78._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar78._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar133._0_4_ = -fVar90 / (fVar68 - fVar90);
              auVar133._4_12_ = auVar78._4_12_;
              auVar132 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar133,ZEXT416(0));
              auVar154 = auVar132;
            }
            else {
              auVar132 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar90 != 0.0) || (auVar154 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar90))) {
                auVar132 = SUB6416(ZEXT464(0xff800000),0);
                auVar154 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar70 = vminss_avx(auVar70,auVar154);
            auVar244 = vmaxss_avx(auVar132,auVar244);
          }
          auVar132 = SUB6416(ZEXT464(0x3f800000),0);
          if ((fVar261 != fVar124) || (NAN(fVar261) || NAN(fVar124))) {
            auVar70 = vminss_avx(auVar70,auVar132);
            auVar244 = vmaxss_avx(auVar132,auVar244);
          }
          auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,auVar70);
          auVar154 = vminss_avx(auVar244,auVar132);
          auVar259 = ZEXT1664(auVar132);
          if (auVar70._0_4_ <= auVar154._0_4_) {
            auVar70 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar70._0_4_ + -0.1)));
            auVar132 = vminss_avx(ZEXT416((uint)(auVar154._0_4_ + 0.1)),auVar132);
            auVar142._0_8_ = auVar71._0_8_;
            auVar142._8_8_ = auVar142._0_8_;
            auVar219._8_8_ = auVar187._0_8_;
            auVar219._0_8_ = auVar187._0_8_;
            auVar233._8_8_ = auVar113._0_8_;
            auVar233._0_8_ = auVar113._0_8_;
            auVar154 = vshufpd_avx(auVar187,auVar187,3);
            auVar131 = vshufpd_avx(auVar113,auVar113,3);
            auVar244 = vshufps_avx(auVar70,auVar132,0);
            auVar79._8_4_ = 0x3f800000;
            auVar79._0_8_ = 0x3f8000003f800000;
            auVar79._12_4_ = 0x3f800000;
            auVar71 = vsubps_avx(auVar79,auVar244);
            fVar124 = auVar244._0_4_;
            auVar80._0_4_ = fVar124 * (float)local_3c8._0_4_;
            fVar90 = auVar244._4_4_;
            auVar80._4_4_ = fVar90 * (float)local_3c8._4_4_;
            fVar68 = auVar244._8_4_;
            auVar80._8_4_ = fVar68 * fStack_3c0;
            fVar91 = auVar244._12_4_;
            auVar80._12_4_ = fVar91 * fStack_3bc;
            auVar177._0_4_ = fVar124 * auVar154._0_4_;
            auVar177._4_4_ = fVar90 * auVar154._4_4_;
            auVar177._8_4_ = fVar68 * auVar154._8_4_;
            auVar177._12_4_ = fVar91 * auVar154._12_4_;
            auVar189._0_4_ = fVar124 * auVar131._0_4_;
            auVar189._4_4_ = fVar90 * auVar131._4_4_;
            auVar189._8_4_ = fVar68 * auVar131._8_4_;
            auVar189._12_4_ = fVar91 * auVar131._12_4_;
            local_508._0_4_ = auVar6._0_4_;
            local_508._4_4_ = auVar6._4_4_;
            fStack_500 = auVar6._8_4_;
            fStack_4fc = auVar6._12_4_;
            auVar208._0_4_ = fVar124 * (float)local_508._0_4_;
            auVar208._4_4_ = fVar90 * (float)local_508._4_4_;
            auVar208._8_4_ = fVar68 * fStack_500;
            auVar208._12_4_ = fVar91 * fStack_4fc;
            auVar131 = vfmadd231ps_fma(auVar80,auVar71,auVar142);
            auVar244 = vfmadd231ps_fma(auVar177,auVar71,auVar219);
            auVar72 = vfmadd231ps_fma(auVar189,auVar71,auVar233);
            auVar71 = vfmadd231ps_fma(auVar208,auVar71,ZEXT816(0));
            auVar6 = vmovshdup_avx(auVar73);
            auVar113 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar70._0_4_)),auVar73,
                                       ZEXT416((uint)(1.0 - auVar70._0_4_)));
            auVar114 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar132._0_4_)),auVar73,
                                       ZEXT416((uint)(1.0 - auVar132._0_4_)));
            fVar124 = 1.0 / fVar69;
            auVar132 = vsubps_avx(auVar244,auVar131);
            auVar220._0_4_ = auVar132._0_4_ * 3.0;
            auVar220._4_4_ = auVar132._4_4_ * 3.0;
            auVar220._8_4_ = auVar132._8_4_ * 3.0;
            auVar220._12_4_ = auVar132._12_4_ * 3.0;
            auVar132 = vsubps_avx(auVar72,auVar244);
            auVar234._0_4_ = auVar132._0_4_ * 3.0;
            auVar234._4_4_ = auVar132._4_4_ * 3.0;
            auVar234._8_4_ = auVar132._8_4_ * 3.0;
            auVar234._12_4_ = auVar132._12_4_ * 3.0;
            auVar132 = vsubps_avx(auVar71,auVar72);
            auVar245._0_4_ = auVar132._0_4_ * 3.0;
            auVar245._4_4_ = auVar132._4_4_ * 3.0;
            auVar245._8_4_ = auVar132._8_4_ * 3.0;
            auVar245._12_4_ = auVar132._12_4_ * 3.0;
            auVar6 = vminps_avx(auVar234,auVar245);
            auVar132 = vmaxps_avx(auVar234,auVar245);
            auVar6 = vminps_avx(auVar220,auVar6);
            auVar132 = vmaxps_avx(auVar220,auVar132);
            auVar70 = vshufpd_avx(auVar6,auVar6,3);
            auVar154 = vshufpd_avx(auVar132,auVar132,3);
            auVar6 = vminps_avx(auVar6,auVar70);
            auVar132 = vmaxps_avx(auVar132,auVar154);
            auVar235._0_4_ = auVar6._0_4_ * fVar124;
            auVar235._4_4_ = auVar6._4_4_ * fVar124;
            auVar235._8_4_ = auVar6._8_4_ * fVar124;
            auVar235._12_4_ = auVar6._12_4_ * fVar124;
            auVar221._0_4_ = auVar132._0_4_ * fVar124;
            auVar221._4_4_ = auVar132._4_4_ * fVar124;
            auVar221._8_4_ = auVar132._8_4_ * fVar124;
            auVar221._12_4_ = auVar132._12_4_ * fVar124;
            fVar124 = 1.0 / (auVar114._0_4_ - auVar113._0_4_);
            auVar132 = vshufpd_avx(auVar131,auVar131,3);
            auVar6 = vshufpd_avx(auVar244,auVar244,3);
            auVar70 = vshufpd_avx(auVar72,auVar72,3);
            auVar154 = vshufpd_avx(auVar71,auVar71,3);
            auVar132 = vsubps_avx(auVar132,auVar131);
            auVar73 = vsubps_avx(auVar6,auVar244);
            auVar131 = vsubps_avx(auVar70,auVar72);
            auVar154 = vsubps_avx(auVar154,auVar71);
            auVar6 = vminps_avx(auVar132,auVar73);
            auVar132 = vmaxps_avx(auVar132,auVar73);
            auVar70 = vminps_avx(auVar131,auVar154);
            auVar70 = vminps_avx(auVar6,auVar70);
            auVar6 = vmaxps_avx(auVar131,auVar154);
            auVar132 = vmaxps_avx(auVar132,auVar6);
            auVar266._0_4_ = fVar124 * auVar70._0_4_;
            auVar266._4_4_ = fVar124 * auVar70._4_4_;
            auVar266._8_4_ = fVar124 * auVar70._8_4_;
            auVar266._12_4_ = fVar124 * auVar70._12_4_;
            auVar252._0_4_ = fVar124 * auVar132._0_4_;
            auVar252._4_4_ = fVar124 * auVar132._4_4_;
            auVar252._8_4_ = fVar124 * auVar132._8_4_;
            auVar252._12_4_ = fVar124 * auVar132._12_4_;
            auVar154 = vinsertps_avx(auVar106,auVar113,0x10);
            auVar73 = vinsertps_avx(auVar135,auVar114,0x10);
            auVar246._0_4_ = (auVar154._0_4_ + auVar73._0_4_) * 0.5;
            auVar246._4_4_ = (auVar154._4_4_ + auVar73._4_4_) * 0.5;
            auVar246._8_4_ = (auVar154._8_4_ + auVar73._8_4_) * 0.5;
            auVar246._12_4_ = (auVar154._12_4_ + auVar73._12_4_) * 0.5;
            auVar81._4_4_ = auVar246._0_4_;
            auVar81._0_4_ = auVar246._0_4_;
            auVar81._8_4_ = auVar246._0_4_;
            auVar81._12_4_ = auVar246._0_4_;
            auVar132 = vfmadd213ps_fma(local_2b8,auVar81,auVar3);
            auVar6 = vfmadd213ps_fma(local_2c8,auVar81,auVar4);
            auVar70 = vfmadd213ps_fma(local_2d8,auVar81,auVar5);
            auVar135 = vsubps_avx(auVar6,auVar132);
            auVar132 = vfmadd213ps_fma(auVar135,auVar81,auVar132);
            auVar135 = vsubps_avx(auVar70,auVar6);
            auVar135 = vfmadd213ps_fma(auVar135,auVar81,auVar6);
            auVar135 = vsubps_avx(auVar135,auVar132);
            auVar132 = vfmadd231ps_fma(auVar132,auVar135,auVar81);
            auVar82._0_8_ = CONCAT44(auVar135._4_4_ * 3.0,auVar135._0_4_ * 3.0);
            auVar82._8_4_ = auVar135._8_4_ * 3.0;
            auVar82._12_4_ = auVar135._12_4_ * 3.0;
            auVar276._8_8_ = auVar132._0_8_;
            auVar276._0_8_ = auVar132._0_8_;
            auVar135 = vshufpd_avx(auVar132,auVar132,3);
            auVar132 = vshufps_avx(auVar246,auVar246,0x55);
            auVar244 = vsubps_avx(auVar135,auVar276);
            auVar72 = vfmadd231ps_fma(auVar276,auVar132,auVar244);
            auVar285._8_8_ = auVar82._0_8_;
            auVar285._0_8_ = auVar82._0_8_;
            auVar135 = vshufpd_avx(auVar82,auVar82,3);
            auVar135 = vsubps_avx(auVar135,auVar285);
            auVar71 = vfmadd213ps_fma(auVar135,auVar132,auVar285);
            auVar132 = vmovshdup_avx(auVar71);
            auVar286._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
            auVar286._8_4_ = auVar132._8_4_ ^ 0x80000000;
            auVar286._12_4_ = auVar132._12_4_ ^ 0x80000000;
            auVar6 = vmovshdup_avx(auVar244);
            auVar135 = vunpcklps_avx(auVar6,auVar286);
            auVar70 = vshufps_avx(auVar135,auVar286,4);
            auVar131 = vshufps_avx(auVar246,auVar246,0x54);
            auVar134._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
            auVar134._8_4_ = auVar244._8_4_ ^ 0x80000000;
            auVar134._12_4_ = auVar244._12_4_ ^ 0x80000000;
            auVar135 = vmovlhps_avx(auVar134,auVar71);
            auVar135 = vshufps_avx(auVar135,auVar71,8);
            auVar132 = vfmsub231ss_fma(ZEXT416((uint)(auVar244._0_4_ * auVar132._0_4_)),auVar6,
                                       auVar71);
            uVar67 = auVar132._0_4_;
            auVar83._4_4_ = uVar67;
            auVar83._0_4_ = uVar67;
            auVar83._8_4_ = uVar67;
            auVar83._12_4_ = uVar67;
            auVar132 = vdivps_avx(auVar70,auVar83);
            auVar6 = vdivps_avx(auVar135,auVar83);
            fVar68 = auVar72._0_4_;
            fVar124 = auVar132._0_4_;
            auVar135 = vshufps_avx(auVar72,auVar72,0x55);
            fVar90 = auVar6._0_4_;
            auVar84._0_4_ = fVar68 * fVar124 + auVar135._0_4_ * fVar90;
            auVar84._4_4_ = fVar68 * auVar132._4_4_ + auVar135._4_4_ * auVar6._4_4_;
            auVar84._8_4_ = fVar68 * auVar132._8_4_ + auVar135._8_4_ * auVar6._8_4_;
            auVar84._12_4_ = fVar68 * auVar132._12_4_ + auVar135._12_4_ * auVar6._12_4_;
            auVar96 = vsubps_avx(auVar131,auVar84);
            auVar131 = vmovshdup_avx(auVar132);
            auVar135 = vinsertps_avx(auVar235,auVar266,0x1c);
            auVar155._0_4_ = auVar131._0_4_ * auVar135._0_4_;
            auVar155._4_4_ = auVar131._4_4_ * auVar135._4_4_;
            auVar155._8_4_ = auVar131._8_4_ * auVar135._8_4_;
            auVar155._12_4_ = auVar131._12_4_ * auVar135._12_4_;
            auVar70 = vinsertps_avx(auVar221,auVar252,0x1c);
            auVar100._0_4_ = auVar70._0_4_ * auVar131._0_4_;
            auVar100._4_4_ = auVar70._4_4_ * auVar131._4_4_;
            auVar100._8_4_ = auVar70._8_4_ * auVar131._8_4_;
            auVar100._12_4_ = auVar70._12_4_ * auVar131._12_4_;
            auVar72 = vminps_avx(auVar155,auVar100);
            auVar71 = vmaxps_avx(auVar100,auVar155);
            auVar131 = vinsertps_avx(auVar266,auVar235,0x4c);
            auVar128 = vmovshdup_avx(auVar6);
            auVar244 = vinsertps_avx(auVar252,auVar221,0x4c);
            auVar253._0_4_ = auVar128._0_4_ * auVar131._0_4_;
            auVar253._4_4_ = auVar128._4_4_ * auVar131._4_4_;
            auVar253._8_4_ = auVar128._8_4_ * auVar131._8_4_;
            auVar253._12_4_ = auVar128._12_4_ * auVar131._12_4_;
            auVar236._0_4_ = auVar128._0_4_ * auVar244._0_4_;
            auVar236._4_4_ = auVar128._4_4_ * auVar244._4_4_;
            auVar236._8_4_ = auVar128._8_4_ * auVar244._8_4_;
            auVar236._12_4_ = auVar128._12_4_ * auVar244._12_4_;
            auVar128 = vminps_avx(auVar253,auVar236);
            auVar267._0_4_ = auVar72._0_4_ + auVar128._0_4_;
            auVar267._4_4_ = auVar72._4_4_ + auVar128._4_4_;
            auVar267._8_4_ = auVar72._8_4_ + auVar128._8_4_;
            auVar267._12_4_ = auVar72._12_4_ + auVar128._12_4_;
            auVar72 = vmaxps_avx(auVar236,auVar253);
            auVar101._0_4_ = auVar72._0_4_ + auVar71._0_4_;
            auVar101._4_4_ = auVar72._4_4_ + auVar71._4_4_;
            auVar101._8_4_ = auVar72._8_4_ + auVar71._8_4_;
            auVar101._12_4_ = auVar72._12_4_ + auVar71._12_4_;
            auVar237._8_8_ = 0x3f80000000000000;
            auVar237._0_8_ = 0x3f80000000000000;
            auVar71 = vsubps_avx(auVar237,auVar101);
            auVar72 = vsubps_avx(auVar237,auVar267);
            auVar128 = vsubps_avx(auVar154,auVar246);
            auVar95 = vsubps_avx(auVar73,auVar246);
            auVar118._0_4_ = fVar124 * auVar135._0_4_;
            auVar118._4_4_ = fVar124 * auVar135._4_4_;
            auVar118._8_4_ = fVar124 * auVar135._8_4_;
            auVar118._12_4_ = fVar124 * auVar135._12_4_;
            auVar268._0_4_ = fVar124 * auVar70._0_4_;
            auVar268._4_4_ = fVar124 * auVar70._4_4_;
            auVar268._8_4_ = fVar124 * auVar70._8_4_;
            auVar268._12_4_ = fVar124 * auVar70._12_4_;
            auVar70 = vminps_avx(auVar118,auVar268);
            auVar135 = vmaxps_avx(auVar268,auVar118);
            auVar156._0_4_ = fVar90 * auVar131._0_4_;
            auVar156._4_4_ = fVar90 * auVar131._4_4_;
            auVar156._8_4_ = fVar90 * auVar131._8_4_;
            auVar156._12_4_ = fVar90 * auVar131._12_4_;
            auVar222._0_4_ = fVar90 * auVar244._0_4_;
            auVar222._4_4_ = fVar90 * auVar244._4_4_;
            auVar222._8_4_ = fVar90 * auVar244._8_4_;
            auVar222._12_4_ = fVar90 * auVar244._12_4_;
            auVar131 = vminps_avx(auVar156,auVar222);
            auVar269._0_4_ = auVar70._0_4_ + auVar131._0_4_;
            auVar269._4_4_ = auVar70._4_4_ + auVar131._4_4_;
            auVar269._8_4_ = auVar70._8_4_ + auVar131._8_4_;
            auVar269._12_4_ = auVar70._12_4_ + auVar131._12_4_;
            fVar261 = auVar128._0_4_;
            auVar277._0_4_ = fVar261 * auVar71._0_4_;
            fVar262 = auVar128._4_4_;
            auVar277._4_4_ = fVar262 * auVar71._4_4_;
            fVar197 = auVar128._8_4_;
            auVar277._8_4_ = fVar197 * auVar71._8_4_;
            fVar198 = auVar128._12_4_;
            auVar277._12_4_ = fVar198 * auVar71._12_4_;
            auVar70 = vmaxps_avx(auVar222,auVar156);
            auVar223._0_4_ = fVar261 * auVar72._0_4_;
            auVar223._4_4_ = fVar262 * auVar72._4_4_;
            auVar223._8_4_ = fVar197 * auVar72._8_4_;
            auVar223._12_4_ = fVar198 * auVar72._12_4_;
            fVar68 = auVar95._0_4_;
            auVar102._0_4_ = fVar68 * auVar71._0_4_;
            fVar91 = auVar95._4_4_;
            auVar102._4_4_ = fVar91 * auVar71._4_4_;
            fVar183 = auVar95._8_4_;
            auVar102._8_4_ = fVar183 * auVar71._8_4_;
            fVar230 = auVar95._12_4_;
            auVar102._12_4_ = fVar230 * auVar71._12_4_;
            auVar238._0_4_ = fVar68 * auVar72._0_4_;
            auVar238._4_4_ = fVar91 * auVar72._4_4_;
            auVar238._8_4_ = fVar183 * auVar72._8_4_;
            auVar238._12_4_ = fVar230 * auVar72._12_4_;
            auVar119._0_4_ = auVar135._0_4_ + auVar70._0_4_;
            auVar119._4_4_ = auVar135._4_4_ + auVar70._4_4_;
            auVar119._8_4_ = auVar135._8_4_ + auVar70._8_4_;
            auVar119._12_4_ = auVar135._12_4_ + auVar70._12_4_;
            auVar157._8_8_ = 0x3f800000;
            auVar157._0_8_ = 0x3f800000;
            auVar135 = vsubps_avx(auVar157,auVar119);
            auVar70 = vsubps_avx(auVar157,auVar269);
            auVar270._0_4_ = fVar261 * auVar135._0_4_;
            auVar270._4_4_ = fVar262 * auVar135._4_4_;
            auVar270._8_4_ = fVar197 * auVar135._8_4_;
            auVar270._12_4_ = fVar198 * auVar135._12_4_;
            auVar254._0_4_ = fVar261 * auVar70._0_4_;
            auVar254._4_4_ = fVar262 * auVar70._4_4_;
            auVar254._8_4_ = fVar197 * auVar70._8_4_;
            auVar254._12_4_ = fVar198 * auVar70._12_4_;
            auVar120._0_4_ = fVar68 * auVar135._0_4_;
            auVar120._4_4_ = fVar91 * auVar135._4_4_;
            auVar120._8_4_ = fVar183 * auVar135._8_4_;
            auVar120._12_4_ = fVar230 * auVar135._12_4_;
            auVar158._0_4_ = fVar68 * auVar70._0_4_;
            auVar158._4_4_ = fVar91 * auVar70._4_4_;
            auVar158._8_4_ = fVar183 * auVar70._8_4_;
            auVar158._12_4_ = fVar230 * auVar70._12_4_;
            auVar135 = vminps_avx(auVar270,auVar254);
            auVar70 = vminps_avx(auVar120,auVar158);
            auVar135 = vminps_avx(auVar135,auVar70);
            auVar70 = vmaxps_avx(auVar254,auVar270);
            auVar131 = vmaxps_avx(auVar158,auVar120);
            auVar244 = vminps_avx(auVar277,auVar223);
            auVar71 = vminps_avx(auVar102,auVar238);
            auVar244 = vminps_avx(auVar244,auVar71);
            auVar135 = vhaddps_avx(auVar135,auVar244);
            auVar70 = vmaxps_avx(auVar131,auVar70);
            auVar259 = ZEXT464(0x3f800000);
            auVar131 = vmaxps_avx(auVar223,auVar277);
            auVar54._4_4_ = uStack_404;
            auVar54._0_4_ = local_408;
            auVar54._8_4_ = uStack_400;
            auVar54._12_4_ = uStack_3fc;
            auVar244 = vmaxps_avx(auVar238,auVar102);
            auVar131 = vmaxps_avx(auVar244,auVar131);
            auVar70 = vhaddps_avx(auVar70,auVar131);
            auVar135 = vshufps_avx(auVar135,auVar135,0xe8);
            auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
            auVar239._0_4_ = auVar96._0_4_ + auVar135._0_4_;
            auVar239._4_4_ = auVar96._4_4_ + auVar135._4_4_;
            auVar239._8_4_ = auVar96._8_4_ + auVar135._8_4_;
            auVar239._12_4_ = auVar96._12_4_ + auVar135._12_4_;
            auVar224._0_4_ = auVar96._0_4_ + auVar70._0_4_;
            auVar224._4_4_ = auVar96._4_4_ + auVar70._4_4_;
            auVar224._8_4_ = auVar96._8_4_ + auVar70._8_4_;
            auVar224._12_4_ = auVar96._12_4_ + auVar70._12_4_;
            auVar228 = ZEXT1664(auVar224);
            auVar135 = vmaxps_avx(auVar154,auVar239);
            auVar70 = vminps_avx(auVar224,auVar73);
            auVar135 = vcmpps_avx(auVar70,auVar135,1);
            auVar135 = vshufps_avx(auVar135,auVar135,0x50);
            if ((auVar135 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar135[0xf]) {
              bVar60 = 0;
              if ((fVar203 < auVar239._0_4_) && (bVar60 = 0, auVar224._0_4_ < auVar73._0_4_)) {
                auVar70 = vmovshdup_avx(auVar239);
                auVar135 = vcmpps_avx(auVar224,auVar73,1);
                bVar60 = auVar135[4] & auVar113._0_4_ < auVar70._0_4_;
              }
              if (((3 < uVar65 || fVar69 < 0.001) | bVar60) != 1) goto LAB_017fe1f3;
              lVar59 = 200;
              do {
                fVar68 = auVar96._0_4_;
                fVar203 = 1.0 - fVar68;
                fVar69 = fVar203 * fVar203 * fVar203;
                fVar92 = fVar68 * 3.0 * fVar203 * fVar203;
                fVar203 = fVar203 * fVar68 * fVar68 * 3.0;
                auVar143._4_4_ = fVar69;
                auVar143._0_4_ = fVar69;
                auVar143._8_4_ = fVar69;
                auVar143._12_4_ = fVar69;
                auVar121._4_4_ = fVar92;
                auVar121._0_4_ = fVar92;
                auVar121._8_4_ = fVar92;
                auVar121._12_4_ = fVar92;
                auVar103._4_4_ = fVar203;
                auVar103._0_4_ = fVar203;
                auVar103._8_4_ = fVar203;
                auVar103._12_4_ = fVar203;
                fVar68 = fVar68 * fVar68 * fVar68;
                auVar159._0_4_ = fVar68 * (float)local_298._0_4_;
                auVar159._4_4_ = fVar68 * (float)local_298._4_4_;
                auVar159._8_4_ = fVar68 * fStack_290;
                auVar159._12_4_ = fVar68 * fStack_28c;
                auVar106 = vfmadd231ps_fma(auVar159,auVar103,auVar5);
                auVar106 = vfmadd231ps_fma(auVar106,auVar121,auVar4);
                auVar106 = vfmadd231ps_fma(auVar106,auVar143,auVar3);
                auVar104._8_8_ = auVar106._0_8_;
                auVar104._0_8_ = auVar106._0_8_;
                auVar106 = vshufpd_avx(auVar106,auVar106,3);
                auVar135 = vshufps_avx(auVar96,auVar96,0x55);
                auVar106 = vsubps_avx(auVar106,auVar104);
                auVar135 = vfmadd213ps_fma(auVar106,auVar135,auVar104);
                fVar69 = auVar135._0_4_;
                auVar106 = vshufps_avx(auVar135,auVar135,0x55);
                auVar105._0_4_ = fVar124 * fVar69 + fVar90 * auVar106._0_4_;
                auVar105._4_4_ = auVar132._4_4_ * fVar69 + auVar6._4_4_ * auVar106._4_4_;
                auVar105._8_4_ = auVar132._8_4_ * fVar69 + auVar6._8_4_ * auVar106._8_4_;
                auVar105._12_4_ = auVar132._12_4_ * fVar69 + auVar6._12_4_ * auVar106._12_4_;
                auVar96 = vsubps_avx(auVar96,auVar105);
                auVar106 = vandps_avx(auVar54,auVar135);
                auVar135 = vshufps_avx(auVar106,auVar106,0xf5);
                auVar106 = vmaxss_avx(auVar135,auVar106);
                if (auVar106._0_4_ < (float)local_2a8._0_4_) {
                  fVar69 = auVar96._0_4_;
                  if ((0.0 <= fVar69) && (fVar69 <= 1.0)) {
                    auVar106 = vmovshdup_avx(auVar96);
                    fVar92 = auVar106._0_4_;
                    if ((0.0 <= fVar92) && (fVar92 <= 1.0)) {
                      auVar106 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar131 = vinsertps_avx(auVar106,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar106 = vdpps_avx(auVar131,local_418,0x7f);
                      auVar135 = vdpps_avx(auVar131,local_428,0x7f);
                      auVar132 = vdpps_avx(auVar131,local_2e8,0x7f);
                      auVar6 = vdpps_avx(auVar131,local_2f8,0x7f);
                      auVar70 = vdpps_avx(auVar131,local_308,0x7f);
                      auVar154 = vdpps_avx(auVar131,local_318,0x7f);
                      auVar73 = vdpps_avx(auVar131,local_328,0x7f);
                      auVar131 = vdpps_avx(auVar131,local_338,0x7f);
                      fVar203 = 1.0 - fVar92;
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar70._0_4_)),
                                                 ZEXT416((uint)fVar203),auVar106);
                      auVar135 = vfmadd231ss_fma(ZEXT416((uint)(auVar154._0_4_ * fVar92)),
                                                 ZEXT416((uint)fVar203),auVar135);
                      auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar92)),
                                                 ZEXT416((uint)fVar203),auVar132);
                      auVar228 = ZEXT1664(auVar132);
                      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar131._0_4_)),
                                               ZEXT416((uint)fVar203),auVar6);
                      fVar68 = 1.0 - fVar69;
                      fVar203 = fVar68 * fVar69 * fVar69 * 3.0;
                      fVar183 = fVar69 * fVar69 * fVar69;
                      auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * auVar6._0_4_)),
                                                 ZEXT416((uint)fVar203),auVar132);
                      fVar124 = fVar69 * 3.0 * fVar68 * fVar68;
                      auVar135 = vfmadd231ss_fma(auVar132,ZEXT416((uint)fVar124),auVar135);
                      fVar90 = fVar68 * fVar68 * fVar68;
                      auVar106 = vfmadd231ss_fma(auVar135,ZEXT416((uint)fVar90),auVar106);
                      fVar91 = auVar106._0_4_;
                      if (((fVar66 <= fVar91) &&
                          (fVar230 = *(float *)(ray + k * 4 + 0x80), fVar91 <= fVar230)) &&
                         (pGVar10 = (context->scene->geometries).items[uVar57].ptr,
                         (pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar106 = vshufps_avx(auVar96,auVar96,0x55);
                        auVar225._8_4_ = 0x3f800000;
                        auVar225._0_8_ = 0x3f8000003f800000;
                        auVar225._12_4_ = 0x3f800000;
                        auVar135 = vsubps_avx(auVar225,auVar106);
                        fVar261 = auVar106._0_4_;
                        auVar240._0_4_ = fVar261 * (float)local_448._0_4_;
                        fVar262 = auVar106._4_4_;
                        auVar240._4_4_ = fVar262 * (float)local_448._4_4_;
                        fVar197 = auVar106._8_4_;
                        auVar240._8_4_ = fVar197 * fStack_440;
                        fVar198 = auVar106._12_4_;
                        auVar240._12_4_ = fVar198 * fStack_43c;
                        auVar247._0_4_ = fVar261 * (float)local_488._0_4_;
                        auVar247._4_4_ = fVar262 * (float)local_488._4_4_;
                        auVar247._8_4_ = fVar197 * fStack_480;
                        auVar247._12_4_ = fVar198 * fStack_47c;
                        auVar255._0_4_ = fVar261 * (float)local_498._0_4_;
                        auVar255._4_4_ = fVar262 * (float)local_498._4_4_;
                        auVar255._8_4_ = fVar197 * fStack_490;
                        auVar255._12_4_ = fVar198 * fStack_48c;
                        auVar271._0_4_ = fVar261 * fVar163;
                        auVar271._4_4_ = fVar262 * fVar180;
                        auVar271._8_4_ = fVar197 * fVar181;
                        auVar271._12_4_ = fVar198 * fVar182;
                        auVar132 = vfmadd231ps_fma(auVar240,auVar135,local_438);
                        auVar6 = vfmadd231ps_fma(auVar247,auVar135,local_468);
                        auVar70 = vfmadd231ps_fma(auVar255,auVar135,local_478);
                        auVar154 = vfmadd231ps_fma(auVar271,auVar135,local_458);
                        auVar135 = vsubps_avx(auVar6,auVar132);
                        auVar132 = vsubps_avx(auVar70,auVar6);
                        auVar6 = vsubps_avx(auVar154,auVar70);
                        local_238._4_4_ = fVar69;
                        local_238._0_4_ = fVar69;
                        local_238._8_4_ = fVar69;
                        local_238._12_4_ = fVar69;
                        auVar228 = ZEXT1664(local_238);
                        auVar272._0_4_ = fVar69 * auVar132._0_4_;
                        auVar272._4_4_ = fVar69 * auVar132._4_4_;
                        auVar272._8_4_ = fVar69 * auVar132._8_4_;
                        auVar272._12_4_ = fVar69 * auVar132._12_4_;
                        auVar209._4_4_ = fVar68;
                        auVar209._0_4_ = fVar68;
                        auVar209._8_4_ = fVar68;
                        auVar209._12_4_ = fVar68;
                        auVar135 = vfmadd231ps_fma(auVar272,auVar209,auVar135);
                        auVar241._0_4_ = fVar69 * auVar6._0_4_;
                        auVar241._4_4_ = fVar69 * auVar6._4_4_;
                        auVar241._8_4_ = fVar69 * auVar6._8_4_;
                        auVar241._12_4_ = fVar69 * auVar6._12_4_;
                        auVar132 = vfmadd231ps_fma(auVar241,auVar209,auVar132);
                        auVar242._0_4_ = fVar69 * auVar132._0_4_;
                        auVar242._4_4_ = fVar69 * auVar132._4_4_;
                        auVar242._8_4_ = fVar69 * auVar132._8_4_;
                        auVar242._12_4_ = fVar69 * auVar132._12_4_;
                        auVar132 = vfmadd231ps_fma(auVar242,auVar209,auVar135);
                        auVar190._0_4_ = fVar183 * (float)local_388._0_4_;
                        auVar190._4_4_ = fVar183 * (float)local_388._4_4_;
                        auVar190._8_4_ = fVar183 * fStack_380;
                        auVar190._12_4_ = fVar183 * fStack_37c;
                        auVar144._4_4_ = fVar203;
                        auVar144._0_4_ = fVar203;
                        auVar144._8_4_ = fVar203;
                        auVar144._12_4_ = fVar203;
                        auVar135 = vfmadd132ps_fma(auVar144,auVar190,local_378);
                        auVar178._4_4_ = fVar124;
                        auVar178._0_4_ = fVar124;
                        auVar178._8_4_ = fVar124;
                        auVar178._12_4_ = fVar124;
                        auVar135 = vfmadd132ps_fma(auVar178,auVar135,local_368);
                        auVar191._0_4_ = auVar132._0_4_ * 3.0;
                        auVar191._4_4_ = auVar132._4_4_ * 3.0;
                        auVar191._8_4_ = auVar132._8_4_ * 3.0;
                        auVar191._12_4_ = auVar132._12_4_ * 3.0;
                        auVar160._4_4_ = fVar90;
                        auVar160._0_4_ = fVar90;
                        auVar160._8_4_ = fVar90;
                        auVar160._12_4_ = fVar90;
                        auVar132 = vfmadd132ps_fma(auVar160,auVar135,local_358);
                        auVar135 = vshufps_avx(auVar191,auVar191,0xc9);
                        auVar145._0_4_ = auVar132._0_4_ * auVar135._0_4_;
                        auVar145._4_4_ = auVar132._4_4_ * auVar135._4_4_;
                        auVar145._8_4_ = auVar132._8_4_ * auVar135._8_4_;
                        auVar145._12_4_ = auVar132._12_4_ * auVar135._12_4_;
                        auVar135 = vshufps_avx(auVar132,auVar132,0xc9);
                        auVar135 = vfmsub231ps_fma(auVar145,auVar191,auVar135);
                        local_248 = auVar135._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar91;
                          uVar67 = vextractps_avx(auVar135,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar67;
                          uVar67 = vextractps_avx(auVar135,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar67;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_248;
                          *(float *)(ray + k * 4 + 0xf0) = fVar69;
                          *(float *)(ray + k * 4 + 0x100) = fVar92;
                          *(uint *)(ray + k * 4 + 0x110) = uVar9;
                          *(uint *)(ray + k * 4 + 0x120) = uVar57;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          auVar259 = ZEXT464(0x3f800000);
                        }
                        else {
                          auVar132 = vshufps_avx(auVar135,auVar135,0x55);
                          auVar135 = vshufps_avx(auVar135,auVar135,0xaa);
                          local_268[0] = (RTCHitN)auVar132[0];
                          local_268[1] = (RTCHitN)auVar132[1];
                          local_268[2] = (RTCHitN)auVar132[2];
                          local_268[3] = (RTCHitN)auVar132[3];
                          local_268[4] = (RTCHitN)auVar132[4];
                          local_268[5] = (RTCHitN)auVar132[5];
                          local_268[6] = (RTCHitN)auVar132[6];
                          local_268[7] = (RTCHitN)auVar132[7];
                          local_268[8] = (RTCHitN)auVar132[8];
                          local_268[9] = (RTCHitN)auVar132[9];
                          local_268[10] = (RTCHitN)auVar132[10];
                          local_268[0xb] = (RTCHitN)auVar132[0xb];
                          local_268[0xc] = (RTCHitN)auVar132[0xc];
                          local_268[0xd] = (RTCHitN)auVar132[0xd];
                          local_268[0xe] = (RTCHitN)auVar132[0xe];
                          local_268[0xf] = (RTCHitN)auVar132[0xf];
                          local_258 = auVar135;
                          uStack_244 = local_248;
                          uStack_240 = local_248;
                          uStack_23c = local_248;
                          local_228 = auVar106;
                          local_218 = CONCAT44(uStack_3a4,local_3a8);
                          uStack_210 = CONCAT44(uStack_39c,uStack_3a0);
                          local_208._4_4_ = uStack_394;
                          local_208._0_4_ = local_398;
                          local_208._8_4_ = uStack_390;
                          local_208._12_4_ = uStack_38c;
                          vpcmpeqd_avx2(ZEXT1632(local_208),ZEXT1632(local_208));
                          uStack_1f4 = context->user->instID[0];
                          local_1f8 = uStack_1f4;
                          uStack_1f0 = uStack_1f4;
                          uStack_1ec = uStack_1f4;
                          uStack_1e8 = context->user->instPrimID[0];
                          uStack_1e4 = uStack_1e8;
                          uStack_1e0 = uStack_1e8;
                          uStack_1dc = uStack_1e8;
                          *(float *)(ray + k * 4 + 0x80) = fVar91;
                          local_528 = *local_510;
                          local_4c8.valid = (int *)local_528;
                          local_4c8.geometryUserPtr = pGVar10->userPtr;
                          local_4c8.context = context->user;
                          local_4c8.hit = local_268;
                          local_4c8.N = 4;
                          local_4c8.ray = (RTCRayN *)ray;
                          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar228 = ZEXT1664(local_238);
                            (*pGVar10->intersectionFilterN)(&local_4c8);
                            auVar112._8_56_ = extraout_var;
                            auVar112._0_8_ = extraout_XMM1_Qa;
                            auVar135 = auVar112._0_16_;
                          }
                          if (local_528 == (undefined1  [16])0x0) {
                            auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar135 = vpcmpeqd_avx(auVar135,auVar135);
                            auVar106 = auVar106 ^ auVar135;
                          }
                          else {
                            p_Var11 = context->args->filter;
                            auVar135 = vpcmpeqd_avx(auVar106,auVar106);
                            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar228 = ZEXT1664(auVar228._0_16_);
                              (*p_Var11)(&local_4c8);
                              auVar135 = vpcmpeqd_avx(auVar135,auVar135);
                            }
                            auVar132 = vpcmpeqd_avx(local_528,_DAT_01f7aa10);
                            auVar106 = auVar132 ^ auVar135;
                            if (local_528 != (undefined1  [16])0x0) {
                              auVar132 = auVar132 ^ auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])local_4c8.hit
                                                       );
                              *(undefined1 (*) [16])(local_4c8.ray + 0xc0) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x10));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xd0) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x20));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xe0) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x30));
                              *(undefined1 (*) [16])(local_4c8.ray + 0xf0) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x40));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x100) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x50));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x110) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x60));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x120) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x70));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x130) = auVar135;
                              auVar135 = vmaskmovps_avx(auVar132,*(undefined1 (*) [16])
                                                                  (local_4c8.hit + 0x80));
                              *(undefined1 (*) [16])(local_4c8.ray + 0x140) = auVar135;
                            }
                          }
                          auVar259 = ZEXT464(0x3f800000);
                          auVar85._8_8_ = 0x100000001;
                          auVar85._0_8_ = 0x100000001;
                          if ((auVar85 & auVar106) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar59 = lVar59 + -1;
              } while (lVar59 != 0);
            }
          }
        }
        else {
          auVar70 = vcmpps_avx(auVar70,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar131 = vcmpps_avx(auVar154,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar70 = vandps_avx(auVar131,auVar70);
          if (-0.0001 < fVar90 && (auVar70 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_017fd575;
        }
        if (uVar65 == 0) break;
      } while( true );
    }
    uVar67 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar89._4_4_ = uVar67;
    auVar89._0_4_ = uVar67;
    auVar89._8_4_ = uVar67;
    auVar89._12_4_ = uVar67;
    auVar89._16_4_ = uVar67;
    auVar89._20_4_ = uVar67;
    auVar89._24_4_ = uVar67;
    auVar89._28_4_ = uVar67;
    auVar86 = vcmpps_avx(local_1d8,auVar89,2);
    uVar57 = vmovmskps_avx(auVar86);
    uVar57 = (uint)uVar63 & uVar57;
    if (uVar57 == 0) {
      return;
    }
  } while( true );
LAB_017fe1f3:
  local_348 = vinsertps_avx(auVar106,ZEXT416((uint)fVar92),0x10);
  auVar73 = vinsertps_avx(auVar113,ZEXT416((uint)auVar114._0_4_),0x10);
  goto LAB_017fccc9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }